

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  Geometry *pGVar2;
  long lVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  size_t k;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  bool bVar54;
  AABBNodeMB4D *node1;
  ulong uVar55;
  ulong uVar56;
  uint uVar57;
  long lVar58;
  undefined1 (*pauVar59) [64];
  long lVar60;
  ulong uVar61;
  QuadMesh *mesh_4;
  QuadMesh *mesh;
  ulong *puVar62;
  NodeRef root;
  ushort uVar63;
  vuint<4> *v;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  int iVar67;
  int iVar113;
  undefined1 auVar68 [16];
  int iVar111;
  int iVar112;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  int iVar125;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar69 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  vfloat_impl<16> vVar101;
  vfloat_impl<16> vVar102;
  vfloat_impl<16> vVar103;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  vfloat_impl<16> vVar106;
  vfloat_impl<16> vVar107;
  vfloat_impl<16> vVar108;
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM25 [64];
  Precalculations pre;
  vint<16> itime;
  RTCFilterFunctionNArguments args;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  vfloat<16> t;
  vfloat<16> v_1;
  vfloat<16> u;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a994;
  uint local_a970;
  Precalculations local_a969;
  ulong local_a968;
  ulong local_a960;
  RayK<16> *local_a958;
  long local_a950;
  uint local_a944;
  undefined1 local_a940 [16];
  _Head_base<1UL,_embree::vfloat_impl<16>_&,_false> _Stack_a930;
  _Head_base<0UL,_embree::vfloat_impl<16>_&,_false> _Stack_a928;
  undefined1 auStack_a920 [32];
  Geometry *local_a8e0;
  undefined1 (*local_a8d8) [32];
  RTCFilterFunctionNArguments local_a8d0;
  BVH *local_a8a0;
  Intersectors *local_a898;
  long local_a890;
  ulong local_a888;
  undefined1 local_a880 [64];
  undefined1 local_a840 [64];
  undefined1 local_a800 [64];
  undefined8 local_a7c0;
  undefined8 uStack_a7b8;
  undefined8 uStack_a7b0;
  undefined8 uStack_a7a8;
  undefined8 uStack_a7a0;
  undefined8 uStack_a798;
  undefined8 uStack_a790;
  undefined8 uStack_a788;
  undefined8 local_a780;
  undefined8 uStack_a778;
  undefined8 uStack_a770;
  undefined8 uStack_a768;
  undefined8 uStack_a760;
  undefined8 uStack_a758;
  undefined8 uStack_a750;
  undefined8 uStack_a748;
  undefined8 local_a740;
  undefined8 uStack_a738;
  undefined8 uStack_a730;
  undefined8 uStack_a728;
  undefined8 uStack_a720;
  undefined8 uStack_a718;
  undefined8 uStack_a710;
  undefined8 uStack_a708;
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a700;
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a2c0;
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  uint local_9fc0;
  uint uStack_9fbc;
  uint uStack_9fb8;
  uint uStack_9fb4;
  uint uStack_9fb0;
  uint uStack_9fac;
  uint uStack_9fa8;
  uint uStack_9fa4;
  uint uStack_9fa0;
  uint uStack_9f9c;
  uint uStack_9f98;
  uint uStack_9f94;
  uint uStack_9f90;
  uint uStack_9f8c;
  uint uStack_9f88;
  uint uStack_9f84;
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_9e48 = (((BVH *)This->ptr)->root).ptr;
  if (local_9e48 != 8) {
    auVar70 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar65 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar127,5);
    uVar56 = vpcmpeqd_avx512f(auVar70,(undefined1  [64])valid_i->field_0);
    uVar65 = uVar65 & uVar56;
    if ((ushort)uVar65 != 0) {
      local_a2c0._0_8_ = *(undefined8 *)ray;
      local_a2c0._8_8_ = *(undefined8 *)(ray + 8);
      local_a2c0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_a2c0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_a2c0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_a2c0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_a2c0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_a2c0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_a2c0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_a2c0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_a2c0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_a2c0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_a2c0._96_8_ = *(undefined8 *)(ray + 0x60);
      local_a2c0._104_8_ = *(undefined8 *)(ray + 0x68);
      local_a2c0._112_8_ = *(undefined8 *)(ray + 0x70);
      local_a2c0._120_8_ = *(undefined8 *)(ray + 0x78);
      local_a2c0._128_8_ = *(undefined8 *)(ray + 0x80);
      local_a2c0._136_8_ = *(undefined8 *)(ray + 0x88);
      local_a2c0._144_8_ = *(undefined8 *)(ray + 0x90);
      local_a2c0._152_8_ = *(undefined8 *)(ray + 0x98);
      local_a2c0._160_8_ = *(undefined8 *)(ray + 0xa0);
      local_a2c0._168_8_ = *(undefined8 *)(ray + 0xa8);
      local_a2c0._176_8_ = *(undefined8 *)(ray + 0xb0);
      local_a2c0._184_8_ = *(undefined8 *)(ray + 0xb8);
      local_a200 = *(undefined1 (*) [64])(ray + 0x100);
      local_a1c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_a180 = *(undefined1 (*) [64])(ray + 0x180);
      auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar70 = vandps_avx512dq(local_a200,auVar71);
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar56 = vcmpps_avx512f(auVar70,auVar72,1);
      auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar70 = vdivps_avx512f(auVar73,local_a200);
      auVar74 = vdivps_avx512f(auVar73,local_a1c0);
      auVar75 = vandps_avx512dq(local_a1c0,auVar71);
      uVar55 = vcmpps_avx512f(auVar75,auVar72,1);
      auVar75 = vandps_avx512dq(local_a180,auVar71);
      auVar76 = vdivps_avx512f(auVar73,local_a180);
      uVar66 = vcmpps_avx512f(auVar75,auVar72,1);
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
      bVar54 = (bool)((byte)uVar56 & 1);
      iVar67 = auVar72._0_4_;
      local_a140._0_4_ = (uint)bVar54 * iVar67 | (uint)!bVar54 * auVar70._0_4_;
      bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
      iVar111 = auVar72._4_4_;
      local_a140._4_4_ = (uint)bVar54 * iVar111 | (uint)!bVar54 * auVar70._4_4_;
      bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
      iVar112 = auVar72._8_4_;
      local_a140._8_4_ = (uint)bVar54 * iVar112 | (uint)!bVar54 * auVar70._8_4_;
      bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
      iVar113 = auVar72._12_4_;
      local_a140._12_4_ = (uint)bVar54 * iVar113 | (uint)!bVar54 * auVar70._12_4_;
      bVar54 = (bool)((byte)(uVar56 >> 4) & 1);
      iVar114 = auVar72._16_4_;
      local_a140._16_4_ = (uint)bVar54 * iVar114 | (uint)!bVar54 * auVar70._16_4_;
      bVar54 = (bool)((byte)(uVar56 >> 5) & 1);
      iVar115 = auVar72._20_4_;
      local_a140._20_4_ = (uint)bVar54 * iVar115 | (uint)!bVar54 * auVar70._20_4_;
      bVar54 = (bool)((byte)(uVar56 >> 6) & 1);
      iVar116 = auVar72._24_4_;
      local_a140._24_4_ = (uint)bVar54 * iVar116 | (uint)!bVar54 * auVar70._24_4_;
      bVar54 = (bool)((byte)(uVar56 >> 7) & 1);
      iVar117 = auVar72._28_4_;
      local_a140._28_4_ = (uint)bVar54 * iVar117 | (uint)!bVar54 * auVar70._28_4_;
      bVar54 = (bool)((byte)(uVar56 >> 8) & 1);
      iVar118 = auVar72._32_4_;
      local_a140._32_4_ = (uint)bVar54 * iVar118 | (uint)!bVar54 * auVar70._32_4_;
      bVar54 = (bool)((byte)(uVar56 >> 9) & 1);
      iVar119 = auVar72._36_4_;
      local_a140._36_4_ = (uint)bVar54 * iVar119 | (uint)!bVar54 * auVar70._36_4_;
      bVar54 = (bool)((byte)(uVar56 >> 10) & 1);
      iVar120 = auVar72._40_4_;
      local_a140._40_4_ = (uint)bVar54 * iVar120 | (uint)!bVar54 * auVar70._40_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xb) & 1);
      iVar121 = auVar72._44_4_;
      local_a140._44_4_ = (uint)bVar54 * iVar121 | (uint)!bVar54 * auVar70._44_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xc) & 1);
      iVar122 = auVar72._48_4_;
      local_a140._48_4_ = (uint)bVar54 * iVar122 | (uint)!bVar54 * auVar70._48_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xd) & 1);
      iVar123 = auVar72._52_4_;
      local_a140._52_4_ = (uint)bVar54 * iVar123 | (uint)!bVar54 * auVar70._52_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xe) & 1);
      iVar124 = auVar72._56_4_;
      iVar125 = auVar72._60_4_;
      local_a140._56_4_ = (uint)bVar54 * iVar124 | (uint)!bVar54 * auVar70._56_4_;
      bVar54 = SUB81(uVar56 >> 0xf,0);
      local_a140._60_4_ = (uint)bVar54 * iVar125 | (uint)!bVar54 * auVar70._60_4_;
      bVar54 = (bool)((byte)uVar55 & 1);
      local_a100._0_4_ = (uint)bVar54 * iVar67 | (uint)!bVar54 * auVar74._0_4_;
      bVar54 = (bool)((byte)(uVar55 >> 1) & 1);
      local_a100._4_4_ = (uint)bVar54 * iVar111 | (uint)!bVar54 * auVar74._4_4_;
      bVar54 = (bool)((byte)(uVar55 >> 2) & 1);
      local_a100._8_4_ = (uint)bVar54 * iVar112 | (uint)!bVar54 * auVar74._8_4_;
      bVar54 = (bool)((byte)(uVar55 >> 3) & 1);
      local_a100._12_4_ = (uint)bVar54 * iVar113 | (uint)!bVar54 * auVar74._12_4_;
      bVar54 = (bool)((byte)(uVar55 >> 4) & 1);
      local_a100._16_4_ = (uint)bVar54 * iVar114 | (uint)!bVar54 * auVar74._16_4_;
      bVar54 = (bool)((byte)(uVar55 >> 5) & 1);
      local_a100._20_4_ = (uint)bVar54 * iVar115 | (uint)!bVar54 * auVar74._20_4_;
      bVar54 = (bool)((byte)(uVar55 >> 6) & 1);
      local_a100._24_4_ = (uint)bVar54 * iVar116 | (uint)!bVar54 * auVar74._24_4_;
      bVar54 = (bool)((byte)(uVar55 >> 7) & 1);
      local_a100._28_4_ = (uint)bVar54 * iVar117 | (uint)!bVar54 * auVar74._28_4_;
      bVar54 = (bool)((byte)(uVar55 >> 8) & 1);
      local_a100._32_4_ = (uint)bVar54 * iVar118 | (uint)!bVar54 * auVar74._32_4_;
      bVar54 = (bool)((byte)(uVar55 >> 9) & 1);
      local_a100._36_4_ = (uint)bVar54 * iVar119 | (uint)!bVar54 * auVar74._36_4_;
      bVar54 = (bool)((byte)(uVar55 >> 10) & 1);
      local_a100._40_4_ = (uint)bVar54 * iVar120 | (uint)!bVar54 * auVar74._40_4_;
      bVar54 = (bool)((byte)(uVar55 >> 0xb) & 1);
      local_a100._44_4_ = (uint)bVar54 * iVar121 | (uint)!bVar54 * auVar74._44_4_;
      bVar54 = (bool)((byte)(uVar55 >> 0xc) & 1);
      local_a100._48_4_ = (uint)bVar54 * iVar122 | (uint)!bVar54 * auVar74._48_4_;
      bVar54 = (bool)((byte)(uVar55 >> 0xd) & 1);
      local_a100._52_4_ = (uint)bVar54 * iVar123 | (uint)!bVar54 * auVar74._52_4_;
      bVar54 = (bool)((byte)(uVar55 >> 0xe) & 1);
      local_a100._56_4_ = (uint)bVar54 * iVar124 | (uint)!bVar54 * auVar74._56_4_;
      bVar54 = SUB81(uVar55 >> 0xf,0);
      local_a100._60_4_ = (uint)bVar54 * iVar125 | (uint)!bVar54 * auVar74._60_4_;
      bVar54 = (bool)((byte)uVar66 & 1);
      local_a0c0._0_4_ = (uint)bVar54 * iVar67 | (uint)!bVar54 * auVar76._0_4_;
      bVar54 = (bool)((byte)(uVar66 >> 1) & 1);
      local_a0c0._4_4_ = (uint)bVar54 * iVar111 | (uint)!bVar54 * auVar76._4_4_;
      bVar54 = (bool)((byte)(uVar66 >> 2) & 1);
      local_a0c0._8_4_ = (uint)bVar54 * iVar112 | (uint)!bVar54 * auVar76._8_4_;
      bVar54 = (bool)((byte)(uVar66 >> 3) & 1);
      local_a0c0._12_4_ = (uint)bVar54 * iVar113 | (uint)!bVar54 * auVar76._12_4_;
      bVar54 = (bool)((byte)(uVar66 >> 4) & 1);
      local_a0c0._16_4_ = (uint)bVar54 * iVar114 | (uint)!bVar54 * auVar76._16_4_;
      bVar54 = (bool)((byte)(uVar66 >> 5) & 1);
      local_a0c0._20_4_ = (uint)bVar54 * iVar115 | (uint)!bVar54 * auVar76._20_4_;
      bVar54 = (bool)((byte)(uVar66 >> 6) & 1);
      local_a0c0._24_4_ = (uint)bVar54 * iVar116 | (uint)!bVar54 * auVar76._24_4_;
      bVar54 = (bool)((byte)(uVar66 >> 7) & 1);
      local_a0c0._28_4_ = (uint)bVar54 * iVar117 | (uint)!bVar54 * auVar76._28_4_;
      bVar54 = (bool)((byte)(uVar66 >> 8) & 1);
      local_a0c0._32_4_ = (uint)bVar54 * iVar118 | (uint)!bVar54 * auVar76._32_4_;
      bVar54 = (bool)((byte)(uVar66 >> 9) & 1);
      local_a0c0._36_4_ = (uint)bVar54 * iVar119 | (uint)!bVar54 * auVar76._36_4_;
      bVar54 = (bool)((byte)(uVar66 >> 10) & 1);
      local_a0c0._40_4_ = (uint)bVar54 * iVar120 | (uint)!bVar54 * auVar76._40_4_;
      bVar54 = (bool)((byte)(uVar66 >> 0xb) & 1);
      local_a0c0._44_4_ = (uint)bVar54 * iVar121 | (uint)!bVar54 * auVar76._44_4_;
      bVar54 = (bool)((byte)(uVar66 >> 0xc) & 1);
      local_a0c0._48_4_ = (uint)bVar54 * iVar122 | (uint)!bVar54 * auVar76._48_4_;
      bVar54 = (bool)((byte)(uVar66 >> 0xd) & 1);
      local_a0c0._52_4_ = (uint)bVar54 * iVar123 | (uint)!bVar54 * auVar76._52_4_;
      bVar54 = (bool)((byte)(uVar66 >> 0xe) & 1);
      local_a0c0._56_4_ = (uint)bVar54 * iVar124 | (uint)!bVar54 * auVar76._56_4_;
      bVar54 = SUB81(uVar66 >> 0xf,0);
      local_a0c0._60_4_ = (uint)bVar54 * iVar125 | (uint)!bVar54 * auVar76._60_4_;
      uVar56 = vcmpps_avx512f(local_a140,auVar127,1);
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar70._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * auVar72._4_4_;
      auVar70._0_4_ = (uint)((byte)uVar56 & 1) * auVar72._0_4_;
      auVar70._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * auVar72._8_4_;
      auVar70._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * auVar72._12_4_;
      auVar70._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar72._16_4_;
      auVar70._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar72._20_4_;
      auVar70._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar72._24_4_;
      auVar70._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * auVar72._28_4_;
      auVar70._32_4_ = (uint)((byte)(uVar56 >> 8) & 1) * auVar72._32_4_;
      auVar70._36_4_ = (uint)((byte)(uVar56 >> 9) & 1) * auVar72._36_4_;
      auVar70._40_4_ = (uint)((byte)(uVar56 >> 10) & 1) * auVar72._40_4_;
      auVar70._44_4_ = (uint)((byte)(uVar56 >> 0xb) & 1) * auVar72._44_4_;
      auVar70._48_4_ = (uint)((byte)(uVar56 >> 0xc) & 1) * auVar72._48_4_;
      auVar70._52_4_ = (uint)((byte)(uVar56 >> 0xd) & 1) * auVar72._52_4_;
      auVar70._56_4_ = (uint)((byte)(uVar56 >> 0xe) & 1) * auVar72._56_4_;
      auVar70._60_4_ = (uint)(byte)(uVar56 >> 0xf) * auVar72._60_4_;
      local_a080 = vmovdqa64_avx512f(auVar70);
      uVar56 = vcmpps_avx512f(local_a100,auVar127,5);
      auVar70 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar54 = (bool)((byte)uVar56 & 1);
      auVar72._0_4_ = (uint)bVar54 * auVar74._0_4_ | (uint)!bVar54 * auVar70._0_4_;
      bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar54 * auVar74._4_4_ | (uint)!bVar54 * auVar70._4_4_;
      bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar54 * auVar74._8_4_ | (uint)!bVar54 * auVar70._8_4_;
      bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar54 * auVar74._12_4_ | (uint)!bVar54 * auVar70._12_4_;
      bVar54 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar72._16_4_ = (uint)bVar54 * auVar74._16_4_ | (uint)!bVar54 * auVar70._16_4_;
      bVar54 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar72._20_4_ = (uint)bVar54 * auVar74._20_4_ | (uint)!bVar54 * auVar70._20_4_;
      bVar54 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar72._24_4_ = (uint)bVar54 * auVar74._24_4_ | (uint)!bVar54 * auVar70._24_4_;
      bVar54 = (bool)((byte)(uVar56 >> 7) & 1);
      auVar72._28_4_ = (uint)bVar54 * auVar74._28_4_ | (uint)!bVar54 * auVar70._28_4_;
      bVar54 = (bool)((byte)(uVar56 >> 8) & 1);
      auVar72._32_4_ = (uint)bVar54 * auVar74._32_4_ | (uint)!bVar54 * auVar70._32_4_;
      bVar54 = (bool)((byte)(uVar56 >> 9) & 1);
      auVar72._36_4_ = (uint)bVar54 * auVar74._36_4_ | (uint)!bVar54 * auVar70._36_4_;
      bVar54 = (bool)((byte)(uVar56 >> 10) & 1);
      auVar72._40_4_ = (uint)bVar54 * auVar74._40_4_ | (uint)!bVar54 * auVar70._40_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xb) & 1);
      auVar72._44_4_ = (uint)bVar54 * auVar74._44_4_ | (uint)!bVar54 * auVar70._44_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xc) & 1);
      auVar72._48_4_ = (uint)bVar54 * auVar74._48_4_ | (uint)!bVar54 * auVar70._48_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xd) & 1);
      auVar72._52_4_ = (uint)bVar54 * auVar74._52_4_ | (uint)!bVar54 * auVar70._52_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xe) & 1);
      auVar72._56_4_ = (uint)bVar54 * auVar74._56_4_ | (uint)!bVar54 * auVar70._56_4_;
      bVar54 = SUB81(uVar56 >> 0xf,0);
      auVar72._60_4_ = (uint)bVar54 * auVar74._60_4_ | (uint)!bVar54 * auVar70._60_4_;
      local_a040 = vmovdqa64_avx512f(auVar72);
      uVar56 = vcmpps_avx512f(local_a0c0,auVar127,5);
      auVar70 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar54 = (bool)((byte)uVar56 & 1);
      auVar74._0_4_ = (uint)bVar54 * auVar72._0_4_ | (uint)!bVar54 * auVar70._0_4_;
      bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar54 * auVar72._4_4_ | (uint)!bVar54 * auVar70._4_4_;
      bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar54 * auVar72._8_4_ | (uint)!bVar54 * auVar70._8_4_;
      bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar54 * auVar72._12_4_ | (uint)!bVar54 * auVar70._12_4_;
      bVar54 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar74._16_4_ = (uint)bVar54 * auVar72._16_4_ | (uint)!bVar54 * auVar70._16_4_;
      bVar54 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar74._20_4_ = (uint)bVar54 * auVar72._20_4_ | (uint)!bVar54 * auVar70._20_4_;
      bVar54 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar74._24_4_ = (uint)bVar54 * auVar72._24_4_ | (uint)!bVar54 * auVar70._24_4_;
      bVar54 = (bool)((byte)(uVar56 >> 7) & 1);
      auVar74._28_4_ = (uint)bVar54 * auVar72._28_4_ | (uint)!bVar54 * auVar70._28_4_;
      bVar54 = (bool)((byte)(uVar56 >> 8) & 1);
      auVar74._32_4_ = (uint)bVar54 * auVar72._32_4_ | (uint)!bVar54 * auVar70._32_4_;
      bVar54 = (bool)((byte)(uVar56 >> 9) & 1);
      auVar74._36_4_ = (uint)bVar54 * auVar72._36_4_ | (uint)!bVar54 * auVar70._36_4_;
      bVar54 = (bool)((byte)(uVar56 >> 10) & 1);
      auVar74._40_4_ = (uint)bVar54 * auVar72._40_4_ | (uint)!bVar54 * auVar70._40_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xb) & 1);
      auVar74._44_4_ = (uint)bVar54 * auVar72._44_4_ | (uint)!bVar54 * auVar70._44_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xc) & 1);
      auVar74._48_4_ = (uint)bVar54 * auVar72._48_4_ | (uint)!bVar54 * auVar70._48_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xd) & 1);
      auVar74._52_4_ = (uint)bVar54 * auVar72._52_4_ | (uint)!bVar54 * auVar70._52_4_;
      bVar54 = (bool)((byte)(uVar56 >> 0xe) & 1);
      auVar74._56_4_ = (uint)bVar54 * auVar72._56_4_ | (uint)!bVar54 * auVar70._56_4_;
      bVar54 = SUB81(uVar56 >> 0xf,0);
      auVar74._60_4_ = (uint)bVar54 * auVar72._60_4_ | (uint)!bVar54 * auVar70._60_4_;
      local_a000 = vmovdqa64_avx512f(auVar74);
      local_8cc0 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a944 = (uint)uVar65;
      auVar70 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar127);
      bVar54 = (bool)((byte)uVar65 & 1);
      local_9fc0 = (uint)bVar54 * auVar70._0_4_ | (uint)!bVar54 * local_8cc0._0_4_;
      bVar54 = (bool)((byte)(uVar65 >> 1) & 1);
      uStack_8c7c = (uint)bVar54 * auVar70._4_4_ | (uint)!bVar54 * local_8cc0._4_4_;
      bVar54 = (bool)((byte)(uVar65 >> 2) & 1);
      uStack_8c78 = (uint)bVar54 * auVar70._8_4_ | (uint)!bVar54 * local_8cc0._8_4_;
      bVar54 = (bool)((byte)(uVar65 >> 3) & 1);
      uStack_8c74 = (uint)bVar54 * auVar70._12_4_ | (uint)!bVar54 * local_8cc0._12_4_;
      bVar54 = (bool)((byte)(uVar65 >> 4) & 1);
      uStack_8c70 = (uint)bVar54 * auVar70._16_4_ | (uint)!bVar54 * local_8cc0._16_4_;
      bVar54 = (bool)((byte)(uVar65 >> 5) & 1);
      uStack_8c6c = (uint)bVar54 * auVar70._20_4_ | (uint)!bVar54 * local_8cc0._20_4_;
      bVar54 = (bool)((byte)(uVar65 >> 6) & 1);
      uStack_8c68 = (uint)bVar54 * auVar70._24_4_ | (uint)!bVar54 * local_8cc0._24_4_;
      bVar54 = (bool)((byte)(uVar65 >> 7) & 1);
      uStack_8c64 = (uint)bVar54 * auVar70._28_4_ | (uint)!bVar54 * local_8cc0._28_4_;
      bVar13 = (byte)(uVar65 >> 8);
      bVar54 = (bool)(bVar13 & 1);
      uStack_8c60 = (uint)bVar54 * auVar70._32_4_ | (uint)!bVar54 * local_8cc0._32_4_;
      bVar54 = (bool)((byte)(uVar65 >> 9) & 1);
      uStack_8c5c = (uint)bVar54 * auVar70._36_4_ | (uint)!bVar54 * local_8cc0._36_4_;
      bVar54 = (bool)((byte)(uVar65 >> 10) & 1);
      uStack_8c58 = (uint)bVar54 * auVar70._40_4_ | (uint)!bVar54 * local_8cc0._40_4_;
      bVar54 = (bool)((byte)(uVar65 >> 0xb) & 1);
      uStack_8c54 = (uint)bVar54 * auVar70._44_4_ | (uint)!bVar54 * local_8cc0._44_4_;
      bVar54 = (bool)((byte)(uVar65 >> 0xc) & 1);
      uStack_8c50 = (uint)bVar54 * auVar70._48_4_ | (uint)!bVar54 * local_8cc0._48_4_;
      bVar54 = (bool)((byte)(uVar65 >> 0xd) & 1);
      uStack_8c4c = (uint)bVar54 * auVar70._52_4_ | (uint)!bVar54 * local_8cc0._52_4_;
      bVar54 = (bool)((byte)(uVar65 >> 0xe) & 1);
      uStack_8c48 = (uint)bVar54 * auVar70._56_4_ | (uint)!bVar54 * local_8cc0._56_4_;
      bVar54 = SUB81(uVar65 >> 0xf,0);
      uStack_8c44 = (uint)bVar54 * auVar70._60_4_ | (uint)!bVar54 * local_8cc0._60_4_;
      uStack_9fbc = uStack_8c7c;
      uStack_9fb8 = uStack_8c78;
      uStack_9fb4 = uStack_8c74;
      uStack_9fb0 = uStack_8c70;
      uStack_9fac = uStack_8c6c;
      uStack_9fa8 = uStack_8c68;
      uStack_9fa4 = uStack_8c64;
      uStack_9fa0 = uStack_8c60;
      uStack_9f9c = uStack_8c5c;
      uStack_9f98 = uStack_8c58;
      uStack_9f94 = uStack_8c54;
      uStack_9f90 = uStack_8c50;
      uStack_9f8c = uStack_8c4c;
      uStack_9f88 = uStack_8c48;
      uStack_9f84 = uStack_8c44;
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar127 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar127);
      bVar54 = (bool)((byte)uVar65 & 1);
      bVar6 = (bool)((byte)(uVar65 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar65 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar65 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar65 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar65 >> 7) & 1);
      bVar14 = (bool)(bVar13 & 1);
      bVar15 = (bool)((byte)(uVar65 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar65 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar65 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar65 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar65 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar65 >> 0xe) & 1);
      bVar21 = SUB81(uVar65 >> 0xf,0);
      local_9f80._4_4_ = (uint)bVar6 * auVar127._4_4_ | (uint)!bVar6 * auVar70._4_4_;
      local_9f80._0_4_ = (uint)bVar54 * auVar127._0_4_ | (uint)!bVar54 * auVar70._0_4_;
      local_9f80._8_4_ = (uint)bVar7 * auVar127._8_4_ | (uint)!bVar7 * auVar70._8_4_;
      local_9f80._12_4_ = (uint)bVar8 * auVar127._12_4_ | (uint)!bVar8 * auVar70._12_4_;
      local_9f80._16_4_ = (uint)bVar9 * auVar127._16_4_ | (uint)!bVar9 * auVar70._16_4_;
      local_9f80._20_4_ = (uint)bVar10 * auVar127._20_4_ | (uint)!bVar10 * auVar70._20_4_;
      local_9f80._24_4_ = (uint)bVar11 * auVar127._24_4_ | (uint)!bVar11 * auVar70._24_4_;
      local_9f80._28_4_ = (uint)bVar12 * auVar127._28_4_ | (uint)!bVar12 * auVar70._28_4_;
      local_9f80._32_4_ = (uint)bVar14 * auVar127._32_4_ | (uint)!bVar14 * auVar70._32_4_;
      local_9f80._36_4_ = (uint)bVar15 * auVar127._36_4_ | (uint)!bVar15 * auVar70._36_4_;
      local_9f80._40_4_ = (uint)bVar16 * auVar127._40_4_ | (uint)!bVar16 * auVar70._40_4_;
      local_9f80._44_4_ = (uint)bVar17 * auVar127._44_4_ | (uint)!bVar17 * auVar70._44_4_;
      local_9f80._48_4_ = (uint)bVar18 * auVar127._48_4_ | (uint)!bVar18 * auVar70._48_4_;
      local_9f80._52_4_ = (uint)bVar19 * auVar127._52_4_ | (uint)!bVar19 * auVar70._52_4_;
      local_9f80._56_4_ = (uint)bVar20 * auVar127._56_4_ | (uint)!bVar20 * auVar70._56_4_;
      local_9f80._60_4_ = (uint)bVar21 * auVar127._60_4_ | (uint)!bVar21 * auVar70._60_4_;
      local_a898 = This;
      local_a8a0 = (BVH *)This->ptr;
      local_a994 = (uint)(ushort)~(ushort)uVar65;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar65 = 0xe;
      }
      else {
        uVar65 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar65 = 0xe;
        }
      }
      local_a958 = ray + 0x200;
      puVar62 = local_9e40;
      local_9e50 = 0xfffffffffffffff8;
      pauVar59 = (undefined1 (*) [64])local_8c40;
      local_8c80 = local_9fc0;
      local_a8d8 = (undefined1 (*) [32])local_a540;
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
      auVar68 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
      auVar74 = ZEXT1664(auVar68);
      auVar70 = local_8cc0;
LAB_01e49628:
      do {
        do {
          root.ptr = puVar62[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01e4b065;
          puVar62 = puVar62 + -1;
          auVar75 = pauVar59[-1];
          pauVar59 = pauVar59 + -1;
          uVar56 = vcmpps_avx512f(auVar75,local_9f80,1);
        } while ((short)uVar56 == 0);
        uVar55 = CONCAT44(0,POPCOUNT((int)uVar56));
        if (uVar65 < uVar55) {
LAB_01e49669:
          do {
            lVar58 = -0x20;
            uVar57 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01e4b065;
              uVar24 = vcmpps_avx512f(auVar75,local_9f80,9);
              if ((short)uVar24 == 0) goto LAB_01e49628;
              local_a890 = (ulong)(uVar57 & 0xf) - 8;
              local_a970 = ~local_a994;
              lVar58 = 0;
              goto LAB_01e498d8;
            }
            uVar56 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar76 = auVar70;
            for (; (lVar58 != 0 && (uVar55 = *(ulong *)(uVar56 + 0x40 + lVar58 * 2), uVar55 != 8));
                lVar58 = lVar58 + 4) {
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x120 + lVar58)));
              auVar86 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar1 = *(undefined4 *)(uVar56 + 0x60 + lVar58);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar27._32_4_ = uVar1;
              auVar27._36_4_ = uVar1;
              auVar27._40_4_ = uVar1;
              auVar27._44_4_ = uVar1;
              auVar27._48_4_ = uVar1;
              auVar27._52_4_ = uVar1;
              auVar27._56_4_ = uVar1;
              auVar27._60_4_ = uVar1;
              auVar77 = vfmadd213ps_avx512f(auVar77,auVar86,auVar27);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x160 + lVar58)));
              uVar1 = *(undefined4 *)(uVar56 + 0xa0 + lVar58);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar28._32_4_ = uVar1;
              auVar28._36_4_ = uVar1;
              auVar28._40_4_ = uVar1;
              auVar28._44_4_ = uVar1;
              auVar28._48_4_ = uVar1;
              auVar28._52_4_ = uVar1;
              auVar28._56_4_ = uVar1;
              auVar28._60_4_ = uVar1;
              auVar78 = vfmadd213ps_avx512f(auVar78,auVar86,auVar28);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x1a0 + lVar58)));
              uVar1 = *(undefined4 *)(uVar56 + 0xe0 + lVar58);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              auVar29._32_4_ = uVar1;
              auVar29._36_4_ = uVar1;
              auVar29._40_4_ = uVar1;
              auVar29._44_4_ = uVar1;
              auVar29._48_4_ = uVar1;
              auVar29._52_4_ = uVar1;
              auVar29._56_4_ = uVar1;
              auVar29._60_4_ = uVar1;
              auVar79 = vfmadd213ps_avx512f(auVar79,auVar86,auVar29);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x140 + lVar58)));
              uVar1 = *(undefined4 *)(uVar56 + 0x80 + lVar58);
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              auVar30._16_4_ = uVar1;
              auVar30._20_4_ = uVar1;
              auVar30._24_4_ = uVar1;
              auVar30._28_4_ = uVar1;
              auVar30._32_4_ = uVar1;
              auVar30._36_4_ = uVar1;
              auVar30._40_4_ = uVar1;
              auVar30._44_4_ = uVar1;
              auVar30._48_4_ = uVar1;
              auVar30._52_4_ = uVar1;
              auVar30._56_4_ = uVar1;
              auVar30._60_4_ = uVar1;
              auVar80 = vfmadd213ps_avx512f(auVar80,auVar86,auVar30);
              auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x180 + lVar58)));
              uVar1 = *(undefined4 *)(uVar56 + 0xc0 + lVar58);
              auVar31._4_4_ = uVar1;
              auVar31._0_4_ = uVar1;
              auVar31._8_4_ = uVar1;
              auVar31._12_4_ = uVar1;
              auVar31._16_4_ = uVar1;
              auVar31._20_4_ = uVar1;
              auVar31._24_4_ = uVar1;
              auVar31._28_4_ = uVar1;
              auVar31._32_4_ = uVar1;
              auVar31._36_4_ = uVar1;
              auVar31._40_4_ = uVar1;
              auVar31._44_4_ = uVar1;
              auVar31._48_4_ = uVar1;
              auVar31._52_4_ = uVar1;
              auVar31._56_4_ = uVar1;
              auVar31._60_4_ = uVar1;
              auVar81 = vfmadd213ps_avx512f(auVar81,auVar86,auVar31);
              auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar56 + 0x1c0 + lVar58)));
              uVar1 = *(undefined4 *)(uVar56 + 0x100 + lVar58);
              auVar32._4_4_ = uVar1;
              auVar32._0_4_ = uVar1;
              auVar32._8_4_ = uVar1;
              auVar32._12_4_ = uVar1;
              auVar32._16_4_ = uVar1;
              auVar32._20_4_ = uVar1;
              auVar32._24_4_ = uVar1;
              auVar32._28_4_ = uVar1;
              auVar32._32_4_ = uVar1;
              auVar32._36_4_ = uVar1;
              auVar32._40_4_ = uVar1;
              auVar32._44_4_ = uVar1;
              auVar32._48_4_ = uVar1;
              auVar32._52_4_ = uVar1;
              auVar32._56_4_ = uVar1;
              auVar32._60_4_ = uVar1;
              auVar82 = vfmadd213ps_avx512f(auVar82,auVar86,auVar32);
              auVar50._8_8_ = local_a2c0._8_8_;
              auVar50._0_8_ = local_a2c0._0_8_;
              auVar50._16_8_ = local_a2c0._16_8_;
              auVar50._24_8_ = local_a2c0._24_8_;
              auVar50._32_8_ = local_a2c0._32_8_;
              auVar50._40_8_ = local_a2c0._40_8_;
              auVar50._48_8_ = local_a2c0._48_8_;
              auVar50._56_8_ = local_a2c0._56_8_;
              auVar51._8_8_ = local_a2c0._72_8_;
              auVar51._0_8_ = local_a2c0._64_8_;
              auVar51._16_8_ = local_a2c0._80_8_;
              auVar51._24_8_ = local_a2c0._88_8_;
              auVar51._32_8_ = local_a2c0._96_8_;
              auVar51._40_8_ = local_a2c0._104_8_;
              auVar51._48_8_ = local_a2c0._112_8_;
              auVar51._56_8_ = local_a2c0._120_8_;
              auVar52._8_8_ = local_a2c0._136_8_;
              auVar52._0_8_ = local_a2c0._128_8_;
              auVar52._16_8_ = local_a2c0._144_8_;
              auVar52._24_8_ = local_a2c0._152_8_;
              auVar52._32_8_ = local_a2c0._160_8_;
              auVar52._40_8_ = local_a2c0._168_8_;
              auVar52._48_8_ = local_a2c0._176_8_;
              auVar52._56_8_ = local_a2c0._184_8_;
              auVar77 = vsubps_avx512f(auVar77,auVar50);
              auVar77 = vmulps_avx512f(auVar77,local_a140);
              auVar78 = vsubps_avx512f(auVar78,auVar51);
              auVar78 = vmulps_avx512f(auVar78,local_a100);
              auVar79 = vsubps_avx512f(auVar79,auVar52);
              auVar79 = vmulps_avx512f(auVar79,local_a0c0);
              auVar80 = vsubps_avx512f(auVar80,auVar50);
              auVar80 = vmulps_avx512f(auVar80,local_a140);
              auVar81 = vsubps_avx512f(auVar81,auVar51);
              auVar81 = vmulps_avx512f(auVar81,local_a100);
              auVar82 = vsubps_avx512f(auVar82,auVar52);
              auVar82 = vmulps_avx512f(auVar82,local_a0c0);
              auVar83 = vpminsd_avx512f(auVar77,auVar80);
              auVar84 = vpminsd_avx512f(auVar78,auVar81);
              auVar83 = vpmaxsd_avx512f(auVar83,auVar84);
              auVar84 = vpminsd_avx512f(auVar79,auVar82);
              auVar83 = vpmaxsd_avx512f(auVar83,auVar84);
              auVar83 = vmulps_avx512f(auVar83,auVar127);
              auVar77 = vpmaxsd_avx512f(auVar77,auVar80);
              auVar78 = vpmaxsd_avx512f(auVar78,auVar81);
              auVar77 = vpminsd_avx512f(auVar77,auVar78);
              auVar78 = vpmaxsd_avx512f(auVar79,auVar82);
              auVar77 = vpminsd_avx512f(auVar77,auVar78);
              auVar77 = vmulps_avx512f(auVar77,auVar72);
              auVar53._4_4_ = uStack_9fbc;
              auVar53._0_4_ = local_9fc0;
              auVar53._8_4_ = uStack_9fb8;
              auVar53._12_4_ = uStack_9fb4;
              auVar53._16_4_ = uStack_9fb0;
              auVar53._20_4_ = uStack_9fac;
              auVar53._24_4_ = uStack_9fa8;
              auVar53._28_4_ = uStack_9fa4;
              auVar53._32_4_ = uStack_9fa0;
              auVar53._36_4_ = uStack_9f9c;
              auVar53._40_4_ = uStack_9f98;
              auVar53._44_4_ = uStack_9f94;
              auVar53._48_4_ = uStack_9f90;
              auVar53._52_4_ = uStack_9f8c;
              auVar53._56_4_ = uStack_9f88;
              auVar53._60_4_ = uStack_9f84;
              auVar78 = vpmaxsd_avx512f(auVar83,auVar53);
              auVar77 = vpminsd_avx512f(auVar77,local_9f80);
              uVar66 = vcmpps_avx512f(auVar78,auVar77,2);
              if ((uVar57 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar56 + 0x1e0 + lVar58);
                auVar33._4_4_ = uVar1;
                auVar33._0_4_ = uVar1;
                auVar33._8_4_ = uVar1;
                auVar33._12_4_ = uVar1;
                auVar33._16_4_ = uVar1;
                auVar33._20_4_ = uVar1;
                auVar33._24_4_ = uVar1;
                auVar33._28_4_ = uVar1;
                auVar33._32_4_ = uVar1;
                auVar33._36_4_ = uVar1;
                auVar33._40_4_ = uVar1;
                auVar33._44_4_ = uVar1;
                auVar33._48_4_ = uVar1;
                auVar33._52_4_ = uVar1;
                auVar33._56_4_ = uVar1;
                auVar33._60_4_ = uVar1;
                uVar61 = vcmpps_avx512f(auVar86,auVar33,0xd);
                uVar1 = *(undefined4 *)(uVar56 + 0x200 + lVar58);
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                auVar34._16_4_ = uVar1;
                auVar34._20_4_ = uVar1;
                auVar34._24_4_ = uVar1;
                auVar34._28_4_ = uVar1;
                auVar34._32_4_ = uVar1;
                auVar34._36_4_ = uVar1;
                auVar34._40_4_ = uVar1;
                auVar34._44_4_ = uVar1;
                auVar34._48_4_ = uVar1;
                auVar34._52_4_ = uVar1;
                auVar34._56_4_ = uVar1;
                auVar34._60_4_ = uVar1;
                uVar23 = vcmpps_avx512f(auVar86,auVar34,1);
                uVar66 = uVar66 & uVar61 & uVar23;
              }
              uVar61 = vcmpps_avx512f(local_9f80,auVar75,6);
              uVar66 = uVar66 & uVar61;
              uVar61 = root.ptr;
              auVar85 = auVar76;
              if ((short)uVar66 != 0) {
                auVar77 = vblendmps_avx512f(auVar70,auVar83);
                bVar54 = (bool)((byte)uVar66 & 1);
                auVar85._0_4_ = (uint)bVar54 * auVar77._0_4_ | (uint)!bVar54 * auVar86._0_4_;
                bVar54 = (bool)((byte)(uVar66 >> 1) & 1);
                auVar85._4_4_ = (uint)bVar54 * auVar77._4_4_ | (uint)!bVar54 * auVar86._4_4_;
                bVar54 = (bool)((byte)(uVar66 >> 2) & 1);
                auVar85._8_4_ = (uint)bVar54 * auVar77._8_4_ | (uint)!bVar54 * auVar86._8_4_;
                bVar54 = (bool)((byte)(uVar66 >> 3) & 1);
                auVar85._12_4_ = (uint)bVar54 * auVar77._12_4_ | (uint)!bVar54 * auVar86._12_4_;
                bVar54 = (bool)((byte)(uVar66 >> 4) & 1);
                auVar85._16_4_ = (uint)bVar54 * auVar77._16_4_ | (uint)!bVar54 * auVar86._16_4_;
                bVar54 = (bool)((byte)(uVar66 >> 5) & 1);
                auVar85._20_4_ = (uint)bVar54 * auVar77._20_4_ | (uint)!bVar54 * auVar86._20_4_;
                bVar54 = (bool)((byte)(uVar66 >> 6) & 1);
                auVar85._24_4_ = (uint)bVar54 * auVar77._24_4_ | (uint)!bVar54 * auVar86._24_4_;
                bVar54 = (bool)((byte)(uVar66 >> 7) & 1);
                auVar85._28_4_ = (uint)bVar54 * auVar77._28_4_ | (uint)!bVar54 * auVar86._28_4_;
                bVar54 = (bool)((byte)(uVar66 >> 8) & 1);
                auVar85._32_4_ = (uint)bVar54 * auVar77._32_4_ | (uint)!bVar54 * auVar86._32_4_;
                bVar54 = (bool)((byte)(uVar66 >> 9) & 1);
                auVar85._36_4_ = (uint)bVar54 * auVar77._36_4_ | (uint)!bVar54 * auVar86._36_4_;
                bVar54 = (bool)((byte)(uVar66 >> 10) & 1);
                auVar85._40_4_ = (uint)bVar54 * auVar77._40_4_ | (uint)!bVar54 * auVar86._40_4_;
                bVar54 = (bool)((byte)(uVar66 >> 0xb) & 1);
                auVar85._44_4_ = (uint)bVar54 * auVar77._44_4_ | (uint)!bVar54 * auVar86._44_4_;
                bVar54 = (bool)((byte)(uVar66 >> 0xc) & 1);
                auVar85._48_4_ = (uint)bVar54 * auVar77._48_4_ | (uint)!bVar54 * auVar86._48_4_;
                bVar54 = (bool)((byte)(uVar66 >> 0xd) & 1);
                auVar85._52_4_ = (uint)bVar54 * auVar77._52_4_ | (uint)!bVar54 * auVar86._52_4_;
                bVar54 = (bool)((byte)(uVar66 >> 0xe) & 1);
                auVar85._56_4_ = (uint)bVar54 * auVar77._56_4_ | (uint)!bVar54 * auVar86._56_4_;
                bVar54 = SUB81(uVar66 >> 0xf,0);
                auVar85._60_4_ = (uint)bVar54 * auVar77._60_4_ | (uint)!bVar54 * auVar86._60_4_;
                uVar61 = uVar55;
                if (root.ptr != 8) {
                  *puVar62 = root.ptr;
                  puVar62 = puVar62 + 1;
                  *pauVar59 = auVar76;
                  pauVar59 = pauVar59 + 1;
                }
              }
              auVar76 = auVar85;
              root.ptr = uVar61;
            }
            if (root.ptr == 8) goto LAB_01e49888;
            uVar24 = vcmpps_avx512f(auVar76,local_9f80,9);
            auVar75 = auVar76;
          } while ((ushort)uVar65 < (ushort)POPCOUNT((int)uVar24));
          *puVar62 = root.ptr;
          puVar62 = puVar62 + 1;
          *pauVar59 = auVar76;
          pauVar59 = pauVar59 + 1;
LAB_01e49888:
          iVar67 = 4;
        }
        else {
          local_a880._0_8_ = uVar55;
          local_a840 = auVar75;
          while (uVar56 != 0) {
            k = 0;
            for (uVar55 = uVar56; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            uVar56 = uVar56 - 1 & uVar56;
            bVar54 = occluded1(local_a898,local_a8a0,root,k,&local_a969,ray,
                               (TravRayK<16,_true> *)&local_a2c0.field_0,context);
            uVar57 = 1 << ((uint)k & 0x1f);
            if (!bVar54) {
              uVar57 = 0;
            }
            local_a994 = local_a994 | uVar57;
          }
          iVar67 = 3;
          auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
          auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
          auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
          auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
          auVar68 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
          auVar74 = ZEXT1664(auVar68);
          if ((short)local_a994 != -1) {
            auVar75 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar54 = (bool)((byte)local_a994 & 1);
            local_9f80._0_4_ = (uint)bVar54 * auVar75._0_4_ | (uint)!bVar54 * local_9f80._0_4_;
            bVar54 = (bool)((byte)(local_a994 >> 1) & 1);
            local_9f80._4_4_ = (uint)bVar54 * auVar75._4_4_ | (uint)!bVar54 * local_9f80._4_4_;
            bVar54 = (bool)((byte)(local_a994 >> 2) & 1);
            local_9f80._8_4_ = (uint)bVar54 * auVar75._8_4_ | (uint)!bVar54 * local_9f80._8_4_;
            bVar54 = (bool)((byte)(local_a994 >> 3) & 1);
            local_9f80._12_4_ = (uint)bVar54 * auVar75._12_4_ | (uint)!bVar54 * local_9f80._12_4_;
            bVar54 = (bool)((byte)(local_a994 >> 4) & 1);
            local_9f80._16_4_ = (uint)bVar54 * auVar75._16_4_ | (uint)!bVar54 * local_9f80._16_4_;
            bVar54 = (bool)((byte)(local_a994 >> 5) & 1);
            local_9f80._20_4_ = (uint)bVar54 * auVar75._20_4_ | (uint)!bVar54 * local_9f80._20_4_;
            bVar54 = (bool)((byte)(local_a994 >> 6) & 1);
            local_9f80._24_4_ = (uint)bVar54 * auVar75._24_4_ | (uint)!bVar54 * local_9f80._24_4_;
            bVar54 = (bool)((byte)(local_a994 >> 7) & 1);
            local_9f80._28_4_ = (uint)bVar54 * auVar75._28_4_ | (uint)!bVar54 * local_9f80._28_4_;
            bVar54 = (bool)((byte)(local_a994 >> 8) & 1);
            local_9f80._32_4_ = (uint)bVar54 * auVar75._32_4_ | (uint)!bVar54 * local_9f80._32_4_;
            bVar54 = (bool)((byte)(local_a994 >> 9) & 1);
            local_9f80._36_4_ = (uint)bVar54 * auVar75._36_4_ | (uint)!bVar54 * local_9f80._36_4_;
            bVar54 = (bool)((byte)(local_a994 >> 10) & 1);
            local_9f80._40_4_ = (uint)bVar54 * auVar75._40_4_ | (uint)!bVar54 * local_9f80._40_4_;
            bVar54 = (bool)((byte)(local_a994 >> 0xb) & 1);
            local_9f80._44_4_ = (uint)bVar54 * auVar75._44_4_ | (uint)!bVar54 * local_9f80._44_4_;
            bVar54 = (bool)((byte)(local_a994 >> 0xc) & 1);
            local_9f80._48_4_ = (uint)bVar54 * auVar75._48_4_ | (uint)!bVar54 * local_9f80._48_4_;
            bVar54 = (bool)((byte)(local_a994 >> 0xd) & 1);
            local_9f80._52_4_ = (uint)bVar54 * auVar75._52_4_ | (uint)!bVar54 * local_9f80._52_4_;
            bVar54 = (bool)((byte)(local_a994 >> 0xe) & 1);
            local_9f80._56_4_ = (uint)bVar54 * auVar75._56_4_ | (uint)!bVar54 * local_9f80._56_4_;
            bVar54 = (bool)((byte)(local_a994 >> 0xf) & 1);
            local_9f80._60_4_ = (uint)bVar54 * auVar75._60_4_ | (uint)!bVar54 * local_9f80._60_4_;
            iVar67 = 2;
          }
          auVar75 = local_a840;
          if ((uint)uVar65 < (uint)local_a880._0_4_) goto LAB_01e49669;
        }
      } while (iVar67 != 3);
LAB_01e4b065:
      local_a994 = local_a994 & local_a944;
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar54 = (bool)((byte)local_a994 & 1);
      bVar6 = (bool)((byte)(local_a994 >> 1) & 1);
      bVar7 = (bool)((byte)(local_a994 >> 2) & 1);
      bVar8 = (bool)((byte)(local_a994 >> 3) & 1);
      bVar9 = (bool)((byte)(local_a994 >> 4) & 1);
      bVar10 = (bool)((byte)(local_a994 >> 5) & 1);
      bVar11 = (bool)((byte)(local_a994 >> 6) & 1);
      bVar12 = (bool)((byte)(local_a994 >> 7) & 1);
      bVar14 = (bool)((byte)(local_a994 >> 8) & 1);
      bVar15 = (bool)((byte)(local_a994 >> 9) & 1);
      bVar16 = (bool)((byte)(local_a994 >> 10) & 1);
      bVar17 = (bool)((byte)(local_a994 >> 0xb) & 1);
      bVar18 = (bool)((byte)(local_a994 >> 0xc) & 1);
      bVar19 = (bool)((byte)(local_a994 >> 0xd) & 1);
      bVar20 = (bool)((byte)(local_a994 >> 0xe) & 1);
      bVar21 = (bool)((byte)(local_a994 >> 0xf) & 1);
      *(uint *)local_a958 = (uint)bVar54 * auVar70._0_4_ | (uint)!bVar54 * *(int *)local_a958;
      *(uint *)(local_a958 + 4) =
           (uint)bVar6 * auVar70._4_4_ | (uint)!bVar6 * *(int *)(local_a958 + 4);
      *(uint *)(local_a958 + 8) =
           (uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * *(int *)(local_a958 + 8);
      *(uint *)(local_a958 + 0xc) =
           (uint)bVar8 * auVar70._12_4_ | (uint)!bVar8 * *(int *)(local_a958 + 0xc);
      *(uint *)(local_a958 + 0x10) =
           (uint)bVar9 * auVar70._16_4_ | (uint)!bVar9 * *(int *)(local_a958 + 0x10);
      *(uint *)(local_a958 + 0x14) =
           (uint)bVar10 * auVar70._20_4_ | (uint)!bVar10 * *(int *)(local_a958 + 0x14);
      *(uint *)(local_a958 + 0x18) =
           (uint)bVar11 * auVar70._24_4_ | (uint)!bVar11 * *(int *)(local_a958 + 0x18);
      *(uint *)(local_a958 + 0x1c) =
           (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * *(int *)(local_a958 + 0x1c);
      *(uint *)(local_a958 + 0x20) =
           (uint)bVar14 * auVar70._32_4_ | (uint)!bVar14 * *(int *)(local_a958 + 0x20);
      *(uint *)(local_a958 + 0x24) =
           (uint)bVar15 * auVar70._36_4_ | (uint)!bVar15 * *(int *)(local_a958 + 0x24);
      *(uint *)(local_a958 + 0x28) =
           (uint)bVar16 * auVar70._40_4_ | (uint)!bVar16 * *(int *)(local_a958 + 0x28);
      *(uint *)(local_a958 + 0x2c) =
           (uint)bVar17 * auVar70._44_4_ | (uint)!bVar17 * *(int *)(local_a958 + 0x2c);
      *(uint *)(local_a958 + 0x30) =
           (uint)bVar18 * auVar70._48_4_ | (uint)!bVar18 * *(int *)(local_a958 + 0x30);
      *(uint *)(local_a958 + 0x34) =
           (uint)bVar19 * auVar70._52_4_ | (uint)!bVar19 * *(int *)(local_a958 + 0x34);
      *(uint *)(local_a958 + 0x38) =
           (uint)bVar20 * auVar70._56_4_ | (uint)!bVar20 * *(int *)(local_a958 + 0x38);
      *(uint *)(local_a958 + 0x3c) =
           (uint)bVar21 * auVar70._60_4_ | (uint)!bVar21 * *(int *)(local_a958 + 0x3c);
    }
  }
  return;
LAB_01e498d8:
  do {
    if (lVar58 == local_a890) goto LAB_01e4af14;
    lVar60 = lVar58 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    local_a968 = 0;
    local_a960 = (ulong)(local_a970 & 0xffff);
    for (uVar56 = local_a960; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      local_a968 = local_a968 + 1;
    }
    uVar56 = (ulong)local_a970;
    lVar64 = 0;
    local_a950 = lVar58;
    do {
      auVar68 = auVar74._0_16_;
      if ((lVar64 == 4) || (iVar67 = *(int *)(lVar60 + 0x50 + lVar64 * 4), iVar67 == -1))
      goto LAB_01e4aef8;
      local_a4c0._0_4_ = iVar67;
      uVar57 = (uint)uVar56;
      local_a840._0_4_ = uVar57;
      local_a888 = (ulong)*(uint *)(lVar60 + 0x40 + lVar64 * 4);
      pGVar2 = (context->scene->geometries).items[local_a888].ptr;
      auVar126._8_8_ = 0;
      auVar126._0_4_ = (pGVar2->time_range).lower;
      auVar126._4_4_ = (pGVar2->time_range).upper;
      auVar75 = vbroadcastss_avx512f(auVar126);
      auVar76 = vbroadcastss_avx512f(ZEXT416((uint)pGVar2->fnumTimeSegments));
      auVar75 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar75);
      auVar69 = vmovshdup_avx(auVar126);
      auVar69 = vsubps_avx(auVar69,auVar126);
      auVar86 = vbroadcastss_avx512f(auVar69);
      auVar75 = vdivps_avx512f(auVar75,auVar86);
      auVar75 = vmulps_avx512f(auVar76,auVar75);
      auVar86 = vrndscaleps_avx512f(auVar75,1);
      auVar69 = vaddss_avx512f(auVar76._0_16_,SUB6416(ZEXT464(0xbf800000),0));
      auVar76 = vbroadcastss_avx512f(auVar69);
      auVar76 = vminps_avx512f(auVar86,auVar76);
      auVar76 = vmaxps_avx512f(auVar76,auVar74);
      auVar86 = vsubps_avx512f(auVar75,auVar76);
      auVar76 = vcvtps2dq_avx512f(auVar76);
      auVar75 = vmovdqa64_avx512f(auVar76);
      _local_a940 = auVar75;
      auVar77 = vpbroadcastd_avx512f();
      uVar24 = vpcmpd_avx512f(auVar77,auVar76,4);
      uVar66 = local_a960;
      uVar55 = local_a968;
      if (((ushort)uVar24 & (ushort)local_a970) == 0) {
        lVar58 = *(long *)(*(long *)&pGVar2[2].numPrimitives +
                          (long)*(int *)(local_a940 + local_a968 * 4) * 0x38);
        lVar3 = *(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                         (long)*(int *)(local_a940 + local_a968 * 4) * 0x38);
        uVar55 = (ulong)*(uint *)(lVar60 + lVar64 * 4);
        uVar66 = (ulong)*(uint *)(lVar60 + 0x10 + lVar64 * 4);
        auVar81 = vsubps_avx512f(auVar73,auVar86);
        uVar1 = *(undefined4 *)(lVar3 + uVar55 * 4);
        auVar87._4_4_ = uVar1;
        auVar87._0_4_ = uVar1;
        auVar87._8_4_ = uVar1;
        auVar87._12_4_ = uVar1;
        auVar87._16_4_ = uVar1;
        auVar87._20_4_ = uVar1;
        auVar87._24_4_ = uVar1;
        auVar87._28_4_ = uVar1;
        auVar87._32_4_ = uVar1;
        auVar87._36_4_ = uVar1;
        auVar87._40_4_ = uVar1;
        auVar87._44_4_ = uVar1;
        auVar87._48_4_ = uVar1;
        auVar87._52_4_ = uVar1;
        auVar87._56_4_ = uVar1;
        auVar87._60_4_ = uVar1;
        auVar76 = vmulps_avx512f(auVar86,auVar87);
        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar55 * 4);
        auVar89._4_4_ = uVar1;
        auVar89._0_4_ = uVar1;
        auVar89._8_4_ = uVar1;
        auVar89._12_4_ = uVar1;
        auVar89._16_4_ = uVar1;
        auVar89._20_4_ = uVar1;
        auVar89._24_4_ = uVar1;
        auVar89._28_4_ = uVar1;
        auVar89._32_4_ = uVar1;
        auVar89._36_4_ = uVar1;
        auVar89._40_4_ = uVar1;
        auVar89._44_4_ = uVar1;
        auVar89._48_4_ = uVar1;
        auVar89._52_4_ = uVar1;
        auVar89._56_4_ = uVar1;
        auVar89._60_4_ = uVar1;
        auVar77 = vmulps_avx512f(auVar86,auVar89);
        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar55 * 4);
        auVar90._4_4_ = uVar1;
        auVar90._0_4_ = uVar1;
        auVar90._8_4_ = uVar1;
        auVar90._12_4_ = uVar1;
        auVar90._16_4_ = uVar1;
        auVar90._20_4_ = uVar1;
        auVar90._24_4_ = uVar1;
        auVar90._28_4_ = uVar1;
        auVar90._32_4_ = uVar1;
        auVar90._36_4_ = uVar1;
        auVar90._40_4_ = uVar1;
        auVar90._44_4_ = uVar1;
        auVar90._48_4_ = uVar1;
        auVar90._52_4_ = uVar1;
        auVar90._56_4_ = uVar1;
        auVar90._60_4_ = uVar1;
        auVar80 = vmulps_avx512f(auVar86,auVar90);
        uVar1 = *(undefined4 *)(lVar58 + uVar55 * 4);
        auVar91._4_4_ = uVar1;
        auVar91._0_4_ = uVar1;
        auVar91._8_4_ = uVar1;
        auVar91._12_4_ = uVar1;
        auVar91._16_4_ = uVar1;
        auVar91._20_4_ = uVar1;
        auVar91._24_4_ = uVar1;
        auVar91._28_4_ = uVar1;
        auVar91._32_4_ = uVar1;
        auVar91._36_4_ = uVar1;
        auVar91._40_4_ = uVar1;
        auVar91._44_4_ = uVar1;
        auVar91._48_4_ = uVar1;
        auVar91._52_4_ = uVar1;
        auVar91._56_4_ = uVar1;
        auVar91._60_4_ = uVar1;
        auVar78 = vfmadd231ps_avx512f(auVar76,auVar81,auVar91);
        uVar1 = *(undefined4 *)(lVar58 + 4 + uVar55 * 4);
        auVar92._4_4_ = uVar1;
        auVar92._0_4_ = uVar1;
        auVar92._8_4_ = uVar1;
        auVar92._12_4_ = uVar1;
        auVar92._16_4_ = uVar1;
        auVar92._20_4_ = uVar1;
        auVar92._24_4_ = uVar1;
        auVar92._28_4_ = uVar1;
        auVar92._32_4_ = uVar1;
        auVar92._36_4_ = uVar1;
        auVar92._40_4_ = uVar1;
        auVar92._44_4_ = uVar1;
        auVar92._48_4_ = uVar1;
        auVar92._52_4_ = uVar1;
        auVar92._56_4_ = uVar1;
        auVar92._60_4_ = uVar1;
        auVar79 = vfmadd231ps_avx512f(auVar77,auVar81,auVar92);
        uVar1 = *(undefined4 *)(lVar58 + 8 + uVar55 * 4);
        auVar93._4_4_ = uVar1;
        auVar93._0_4_ = uVar1;
        auVar93._8_4_ = uVar1;
        auVar93._12_4_ = uVar1;
        auVar93._16_4_ = uVar1;
        auVar93._20_4_ = uVar1;
        auVar93._24_4_ = uVar1;
        auVar93._28_4_ = uVar1;
        auVar93._32_4_ = uVar1;
        auVar93._36_4_ = uVar1;
        auVar93._40_4_ = uVar1;
        auVar93._44_4_ = uVar1;
        auVar93._48_4_ = uVar1;
        auVar93._52_4_ = uVar1;
        auVar93._56_4_ = uVar1;
        auVar93._60_4_ = uVar1;
        auVar80 = vfmadd231ps_avx512f(auVar80,auVar81,auVar93);
        uVar1 = *(undefined4 *)(lVar3 + uVar66 * 4);
        auVar94._4_4_ = uVar1;
        auVar94._0_4_ = uVar1;
        auVar94._8_4_ = uVar1;
        auVar94._12_4_ = uVar1;
        auVar94._16_4_ = uVar1;
        auVar94._20_4_ = uVar1;
        auVar94._24_4_ = uVar1;
        auVar94._28_4_ = uVar1;
        auVar94._32_4_ = uVar1;
        auVar94._36_4_ = uVar1;
        auVar94._40_4_ = uVar1;
        auVar94._44_4_ = uVar1;
        auVar94._48_4_ = uVar1;
        auVar94._52_4_ = uVar1;
        auVar94._56_4_ = uVar1;
        auVar94._60_4_ = uVar1;
        auVar76 = vmulps_avx512f(auVar86,auVar94);
        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar66 * 4);
        auVar95._4_4_ = uVar1;
        auVar95._0_4_ = uVar1;
        auVar95._8_4_ = uVar1;
        auVar95._12_4_ = uVar1;
        auVar95._16_4_ = uVar1;
        auVar95._20_4_ = uVar1;
        auVar95._24_4_ = uVar1;
        auVar95._28_4_ = uVar1;
        auVar95._32_4_ = uVar1;
        auVar95._36_4_ = uVar1;
        auVar95._40_4_ = uVar1;
        auVar95._44_4_ = uVar1;
        auVar95._48_4_ = uVar1;
        auVar95._52_4_ = uVar1;
        auVar95._56_4_ = uVar1;
        auVar95._60_4_ = uVar1;
        auVar77 = vmulps_avx512f(auVar86,auVar95);
        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar66 * 4);
        auVar96._4_4_ = uVar1;
        auVar96._0_4_ = uVar1;
        auVar96._8_4_ = uVar1;
        auVar96._12_4_ = uVar1;
        auVar96._16_4_ = uVar1;
        auVar96._20_4_ = uVar1;
        auVar96._24_4_ = uVar1;
        auVar96._28_4_ = uVar1;
        auVar96._32_4_ = uVar1;
        auVar96._36_4_ = uVar1;
        auVar96._40_4_ = uVar1;
        auVar96._44_4_ = uVar1;
        auVar96._48_4_ = uVar1;
        auVar96._52_4_ = uVar1;
        auVar96._56_4_ = uVar1;
        auVar96._60_4_ = uVar1;
        auVar82 = vmulps_avx512f(auVar86,auVar96);
        uVar1 = *(undefined4 *)(lVar58 + uVar66 * 4);
        auVar97._4_4_ = uVar1;
        auVar97._0_4_ = uVar1;
        auVar97._8_4_ = uVar1;
        auVar97._12_4_ = uVar1;
        auVar97._16_4_ = uVar1;
        auVar97._20_4_ = uVar1;
        auVar97._24_4_ = uVar1;
        auVar97._28_4_ = uVar1;
        auVar97._32_4_ = uVar1;
        auVar97._36_4_ = uVar1;
        auVar97._40_4_ = uVar1;
        auVar97._44_4_ = uVar1;
        auVar97._48_4_ = uVar1;
        auVar97._52_4_ = uVar1;
        auVar97._56_4_ = uVar1;
        auVar97._60_4_ = uVar1;
        auVar76 = vfmadd231ps_avx512f(auVar76,auVar81,auVar97);
        uVar1 = *(undefined4 *)(lVar58 + 4 + uVar66 * 4);
        auVar98._4_4_ = uVar1;
        auVar98._0_4_ = uVar1;
        auVar98._8_4_ = uVar1;
        auVar98._12_4_ = uVar1;
        auVar98._16_4_ = uVar1;
        auVar98._20_4_ = uVar1;
        auVar98._24_4_ = uVar1;
        auVar98._28_4_ = uVar1;
        auVar98._32_4_ = uVar1;
        auVar98._36_4_ = uVar1;
        auVar98._40_4_ = uVar1;
        auVar98._44_4_ = uVar1;
        auVar98._48_4_ = uVar1;
        auVar98._52_4_ = uVar1;
        auVar98._56_4_ = uVar1;
        auVar98._60_4_ = uVar1;
        auVar84 = vfmadd231ps_avx512f(auVar77,auVar81,auVar98);
        uVar1 = *(undefined4 *)(lVar58 + 8 + uVar66 * 4);
        auVar99._4_4_ = uVar1;
        auVar99._0_4_ = uVar1;
        auVar99._8_4_ = uVar1;
        auVar99._12_4_ = uVar1;
        auVar99._16_4_ = uVar1;
        auVar99._20_4_ = uVar1;
        auVar99._24_4_ = uVar1;
        auVar99._28_4_ = uVar1;
        auVar99._32_4_ = uVar1;
        auVar99._36_4_ = uVar1;
        auVar99._40_4_ = uVar1;
        auVar99._44_4_ = uVar1;
        auVar99._48_4_ = uVar1;
        auVar99._52_4_ = uVar1;
        auVar99._56_4_ = uVar1;
        auVar99._60_4_ = uVar1;
        local_9f00 = vfmadd231ps_avx512f(auVar82,auVar81,auVar99);
        uVar55 = (ulong)*(uint *)(lVar60 + 0x20 + lVar64 * 4);
        uVar1 = *(undefined4 *)(lVar3 + uVar55 * 4);
        auVar100._4_4_ = uVar1;
        auVar100._0_4_ = uVar1;
        auVar100._8_4_ = uVar1;
        auVar100._12_4_ = uVar1;
        auVar100._16_4_ = uVar1;
        auVar100._20_4_ = uVar1;
        auVar100._24_4_ = uVar1;
        auVar100._28_4_ = uVar1;
        auVar100._32_4_ = uVar1;
        auVar100._36_4_ = uVar1;
        auVar100._40_4_ = uVar1;
        auVar100._44_4_ = uVar1;
        auVar100._48_4_ = uVar1;
        auVar100._52_4_ = uVar1;
        auVar100._56_4_ = uVar1;
        auVar100._60_4_ = uVar1;
        auVar77 = vmulps_avx512f(auVar86,auVar100);
        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar55 * 4);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        auVar35._16_4_ = uVar1;
        auVar35._20_4_ = uVar1;
        auVar35._24_4_ = uVar1;
        auVar35._28_4_ = uVar1;
        auVar35._32_4_ = uVar1;
        auVar35._36_4_ = uVar1;
        auVar35._40_4_ = uVar1;
        auVar35._44_4_ = uVar1;
        auVar35._48_4_ = uVar1;
        auVar35._52_4_ = uVar1;
        auVar35._56_4_ = uVar1;
        auVar35._60_4_ = uVar1;
        auVar82 = vmulps_avx512f(auVar86,auVar35);
        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar55 * 4);
        auVar36._4_4_ = uVar1;
        auVar36._0_4_ = uVar1;
        auVar36._8_4_ = uVar1;
        auVar36._12_4_ = uVar1;
        auVar36._16_4_ = uVar1;
        auVar36._20_4_ = uVar1;
        auVar36._24_4_ = uVar1;
        auVar36._28_4_ = uVar1;
        auVar36._32_4_ = uVar1;
        auVar36._36_4_ = uVar1;
        auVar36._40_4_ = uVar1;
        auVar36._44_4_ = uVar1;
        auVar36._48_4_ = uVar1;
        auVar36._52_4_ = uVar1;
        auVar36._56_4_ = uVar1;
        auVar36._60_4_ = uVar1;
        auVar83 = vmulps_avx512f(auVar86,auVar36);
        uVar1 = *(undefined4 *)(lVar58 + uVar55 * 4);
        auVar37._4_4_ = uVar1;
        auVar37._0_4_ = uVar1;
        auVar37._8_4_ = uVar1;
        auVar37._12_4_ = uVar1;
        auVar37._16_4_ = uVar1;
        auVar37._20_4_ = uVar1;
        auVar37._24_4_ = uVar1;
        auVar37._28_4_ = uVar1;
        auVar37._32_4_ = uVar1;
        auVar37._36_4_ = uVar1;
        auVar37._40_4_ = uVar1;
        auVar37._44_4_ = uVar1;
        auVar37._48_4_ = uVar1;
        auVar37._52_4_ = uVar1;
        auVar37._56_4_ = uVar1;
        auVar37._60_4_ = uVar1;
        local_a380 = vfmadd231ps_avx512f(auVar77,auVar81,auVar37);
        uVar1 = *(undefined4 *)(lVar58 + 4 + uVar55 * 4);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar38._16_4_ = uVar1;
        auVar38._20_4_ = uVar1;
        auVar38._24_4_ = uVar1;
        auVar38._28_4_ = uVar1;
        auVar38._32_4_ = uVar1;
        auVar38._36_4_ = uVar1;
        auVar38._40_4_ = uVar1;
        auVar38._44_4_ = uVar1;
        auVar38._48_4_ = uVar1;
        auVar38._52_4_ = uVar1;
        auVar38._56_4_ = uVar1;
        auVar38._60_4_ = uVar1;
        local_a300 = vfmadd231ps_avx512f(auVar82,auVar81,auVar38);
        uVar1 = *(undefined4 *)(lVar58 + 8 + uVar55 * 4);
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar39._16_4_ = uVar1;
        auVar39._20_4_ = uVar1;
        auVar39._24_4_ = uVar1;
        auVar39._28_4_ = uVar1;
        auVar39._32_4_ = uVar1;
        auVar39._36_4_ = uVar1;
        auVar39._40_4_ = uVar1;
        auVar39._44_4_ = uVar1;
        auVar39._48_4_ = uVar1;
        auVar39._52_4_ = uVar1;
        auVar39._56_4_ = uVar1;
        auVar39._60_4_ = uVar1;
        local_a340 = vfmadd231ps_avx512f(auVar83,auVar81,auVar39);
        uVar55 = (ulong)*(uint *)(lVar60 + 0x30 + lVar64 * 4);
        uVar1 = *(undefined4 *)(lVar3 + uVar55 * 4);
        auVar40._4_4_ = uVar1;
        auVar40._0_4_ = uVar1;
        auVar40._8_4_ = uVar1;
        auVar40._12_4_ = uVar1;
        auVar40._16_4_ = uVar1;
        auVar40._20_4_ = uVar1;
        auVar40._24_4_ = uVar1;
        auVar40._28_4_ = uVar1;
        auVar40._32_4_ = uVar1;
        auVar40._36_4_ = uVar1;
        auVar40._40_4_ = uVar1;
        auVar40._44_4_ = uVar1;
        auVar40._48_4_ = uVar1;
        auVar40._52_4_ = uVar1;
        auVar40._56_4_ = uVar1;
        auVar40._60_4_ = uVar1;
        auVar77 = vmulps_avx512f(auVar86,auVar40);
        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar55 * 4);
        auVar41._4_4_ = uVar1;
        auVar41._0_4_ = uVar1;
        auVar41._8_4_ = uVar1;
        auVar41._12_4_ = uVar1;
        auVar41._16_4_ = uVar1;
        auVar41._20_4_ = uVar1;
        auVar41._24_4_ = uVar1;
        auVar41._28_4_ = uVar1;
        auVar41._32_4_ = uVar1;
        auVar41._36_4_ = uVar1;
        auVar41._40_4_ = uVar1;
        auVar41._44_4_ = uVar1;
        auVar41._48_4_ = uVar1;
        auVar41._52_4_ = uVar1;
        auVar41._56_4_ = uVar1;
        auVar41._60_4_ = uVar1;
        auVar82 = vmulps_avx512f(auVar86,auVar41);
        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar55 * 4);
        auVar42._4_4_ = uVar1;
        auVar42._0_4_ = uVar1;
        auVar42._8_4_ = uVar1;
        auVar42._12_4_ = uVar1;
        auVar42._16_4_ = uVar1;
        auVar42._20_4_ = uVar1;
        auVar42._24_4_ = uVar1;
        auVar42._28_4_ = uVar1;
        auVar42._32_4_ = uVar1;
        auVar42._36_4_ = uVar1;
        auVar42._40_4_ = uVar1;
        auVar42._44_4_ = uVar1;
        auVar42._48_4_ = uVar1;
        auVar42._52_4_ = uVar1;
        auVar42._56_4_ = uVar1;
        auVar42._60_4_ = uVar1;
        auVar83 = vmulps_avx512f(auVar86,auVar42);
        uVar1 = *(undefined4 *)(lVar58 + uVar55 * 4);
        auVar86._4_4_ = uVar1;
        auVar86._0_4_ = uVar1;
        auVar86._8_4_ = uVar1;
        auVar86._12_4_ = uVar1;
        auVar86._16_4_ = uVar1;
        auVar86._20_4_ = uVar1;
        auVar86._24_4_ = uVar1;
        auVar86._28_4_ = uVar1;
        auVar86._32_4_ = uVar1;
        auVar86._36_4_ = uVar1;
        auVar86._40_4_ = uVar1;
        auVar86._44_4_ = uVar1;
        auVar86._48_4_ = uVar1;
        auVar86._52_4_ = uVar1;
        auVar86._56_4_ = uVar1;
        auVar86._60_4_ = uVar1;
        auVar77 = vfmadd231ps_avx512f(auVar77,auVar81,auVar86);
        uVar1 = *(undefined4 *)(lVar58 + 4 + uVar55 * 4);
        auVar43._4_4_ = uVar1;
        auVar43._0_4_ = uVar1;
        auVar43._8_4_ = uVar1;
        auVar43._12_4_ = uVar1;
        auVar43._16_4_ = uVar1;
        auVar43._20_4_ = uVar1;
        auVar43._24_4_ = uVar1;
        auVar43._28_4_ = uVar1;
        auVar43._32_4_ = uVar1;
        auVar43._36_4_ = uVar1;
        auVar43._40_4_ = uVar1;
        auVar43._44_4_ = uVar1;
        auVar43._48_4_ = uVar1;
        auVar43._52_4_ = uVar1;
        auVar43._56_4_ = uVar1;
        auVar43._60_4_ = uVar1;
        local_9f40 = vfmadd231ps_avx512f(auVar82,auVar81,auVar43);
        uVar1 = *(undefined4 *)(lVar58 + 8 + uVar55 * 4);
        auVar44._4_4_ = uVar1;
        auVar44._0_4_ = uVar1;
        auVar44._8_4_ = uVar1;
        auVar44._12_4_ = uVar1;
        auVar44._16_4_ = uVar1;
        auVar44._20_4_ = uVar1;
        auVar44._24_4_ = uVar1;
        auVar44._28_4_ = uVar1;
        auVar44._32_4_ = uVar1;
        auVar44._36_4_ = uVar1;
        auVar44._40_4_ = uVar1;
        auVar44._44_4_ = uVar1;
        auVar44._48_4_ = uVar1;
        auVar44._52_4_ = uVar1;
        auVar44._56_4_ = uVar1;
        auVar44._60_4_ = uVar1;
        local_a880 = vfmadd231ps_avx512f(auVar83,auVar81,auVar44);
      }
      else {
        while (auVar77 = (undefined1  [64])local_a700.field_0.z.field_0,
              auVar76 = (undefined1  [64])local_a700.field_0.x.field_0, uVar66 != 0) {
          uVar61 = (ulong)*(uint *)(lVar60 + lVar64 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar2[2].numPrimitives +
                               (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          auVar126 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          *(int *)((long)&local_a700 + uVar55 * 4) = auVar69._0_4_;
          uVar1 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a7c0 + uVar55 * 4) = auVar126._0_4_;
          uVar1 = vextractps_avx(auVar126,1);
          *(undefined4 *)((long)&local_a780 + uVar55 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar126,2);
          *(undefined4 *)((long)&local_a740 + uVar55 * 4) = uVar1;
          uVar61 = uVar55 & 0x3f;
          uVar55 = 0;
          uVar66 = uVar66 ^ 1L << uVar61;
          for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            uVar55 = uVar55 + 1;
          }
        }
        auVar81 = vsubps_avx512f(auVar73,auVar86);
        auVar80 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.y.field_0);
        auVar78._8_8_ = uStack_a7b8;
        auVar78._0_8_ = local_a7c0;
        auVar78._16_8_ = uStack_a7b0;
        auVar78._24_8_ = uStack_a7a8;
        auVar78._32_8_ = uStack_a7a0;
        auVar78._40_8_ = uStack_a798;
        auVar78._48_8_ = uStack_a790;
        auVar78._56_8_ = uStack_a788;
        auVar79._8_8_ = uStack_a778;
        auVar79._0_8_ = local_a780;
        auVar79._16_8_ = uStack_a770;
        auVar79._24_8_ = uStack_a768;
        auVar79._32_8_ = uStack_a760;
        auVar79._40_8_ = uStack_a758;
        auVar79._48_8_ = uStack_a750;
        auVar79._56_8_ = uStack_a748;
        auVar79 = vmulps_avx512f(auVar86,auVar79);
        auVar79 = vaddps_avx512f(auVar80,auVar79);
        auVar80._8_8_ = uStack_a738;
        auVar80._0_8_ = local_a740;
        auVar80._16_8_ = uStack_a730;
        auVar80._24_8_ = uStack_a728;
        auVar80._32_8_ = uStack_a720;
        auVar80._40_8_ = uStack_a718;
        auVar80._48_8_ = uStack_a710;
        auVar80._56_8_ = uStack_a708;
        auVar80 = vmulps_avx512f(auVar86,auVar80);
        uVar66 = local_a960;
        uVar55 = local_a968;
        while (auVar83 = (undefined1  [64])local_a700.field_0.z.field_0,
              auVar82 = (undefined1  [64])local_a700.field_0.x.field_0, uVar66 != 0) {
          uVar61 = (ulong)*(uint *)(lVar60 + 0x10 + lVar64 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar2[2].numPrimitives +
                               (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          auVar126 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          *(int *)((long)&local_a700 + uVar55 * 4) = auVar69._0_4_;
          uVar1 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a7c0 + uVar55 * 4) = auVar126._0_4_;
          uVar1 = vextractps_avx(auVar126,1);
          *(undefined4 *)((long)&local_a780 + uVar55 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar126,2);
          *(undefined4 *)((long)&local_a740 + uVar55 * 4) = uVar1;
          uVar61 = uVar55 & 0x3f;
          uVar55 = 0;
          uVar66 = uVar66 ^ 1L << uVar61;
          for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            uVar55 = uVar55 + 1;
          }
        }
        auVar84 = vmulps_avx512f(auVar81,auVar76);
        auVar78 = vmulps_avx512f(auVar86,auVar78);
        auVar104 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.y.field_0);
        auVar76._8_8_ = uStack_a7b8;
        auVar76._0_8_ = local_a7c0;
        auVar76._16_8_ = uStack_a7b0;
        auVar76._24_8_ = uStack_a7a8;
        auVar76._32_8_ = uStack_a7a0;
        auVar76._40_8_ = uStack_a798;
        auVar76._48_8_ = uStack_a790;
        auVar76._56_8_ = uStack_a788;
        auVar78 = vaddps_avx512f(auVar84,auVar78);
        auVar84._8_8_ = uStack_a778;
        auVar84._0_8_ = local_a780;
        auVar84._16_8_ = uStack_a770;
        auVar84._24_8_ = uStack_a768;
        auVar84._32_8_ = uStack_a760;
        auVar84._40_8_ = uStack_a758;
        auVar84._48_8_ = uStack_a750;
        auVar84._56_8_ = uStack_a748;
        auVar84 = vmulps_avx512f(auVar86,auVar84);
        auVar84 = vaddps_avx512f(auVar104,auVar84);
        auVar104._8_8_ = uStack_a738;
        auVar104._0_8_ = local_a740;
        auVar104._16_8_ = uStack_a730;
        auVar104._24_8_ = uStack_a728;
        auVar104._32_8_ = uStack_a720;
        auVar104._40_8_ = uStack_a718;
        auVar104._48_8_ = uStack_a710;
        auVar104._56_8_ = uStack_a708;
        auVar104 = vmulps_avx512f(auVar86,auVar104);
        uVar66 = local_a960;
        uVar55 = local_a968;
        while (auVar87 = (undefined1  [64])local_a700.field_0.z.field_0,
              auVar105 = (undefined1  [64])local_a700.field_0.x.field_0, uVar66 != 0) {
          uVar61 = (ulong)*(uint *)(lVar60 + 0x20 + lVar64 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar2[2].numPrimitives +
                               (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          auVar126 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          *(int *)((long)&local_a700 + uVar55 * 4) = auVar69._0_4_;
          uVar1 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a7c0 + uVar55 * 4) = auVar126._0_4_;
          uVar1 = vextractps_avx(auVar126,1);
          *(undefined4 *)((long)&local_a780 + uVar55 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar126,2);
          *(undefined4 *)((long)&local_a740 + uVar55 * 4) = uVar1;
          uVar61 = uVar55 & 0x3f;
          uVar55 = 0;
          uVar66 = uVar66 ^ 1L << uVar61;
          for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            uVar55 = uVar55 + 1;
          }
        }
        auVar89 = vmulps_avx512f(auVar81,auVar77);
        auVar82 = vmulps_avx512f(auVar81,auVar82);
        auVar76 = vmulps_avx512f(auVar86,auVar76);
        auVar88 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.y.field_0);
        auVar77._8_8_ = uStack_a7b8;
        auVar77._0_8_ = local_a7c0;
        auVar77._16_8_ = uStack_a7b0;
        auVar77._24_8_ = uStack_a7a8;
        auVar77._32_8_ = uStack_a7a0;
        auVar77._40_8_ = uStack_a798;
        auVar77._48_8_ = uStack_a790;
        auVar77._56_8_ = uStack_a788;
        auVar76 = vaddps_avx512f(auVar82,auVar76);
        auVar82._8_8_ = uStack_a778;
        auVar82._0_8_ = local_a780;
        auVar82._16_8_ = uStack_a770;
        auVar82._24_8_ = uStack_a768;
        auVar82._32_8_ = uStack_a760;
        auVar82._40_8_ = uStack_a758;
        auVar82._48_8_ = uStack_a750;
        auVar82._56_8_ = uStack_a748;
        auVar82 = vmulps_avx512f(auVar86,auVar82);
        local_a300 = vaddps_avx512f(auVar88,auVar82);
        auVar88._8_8_ = uStack_a738;
        auVar88._0_8_ = local_a740;
        auVar88._16_8_ = uStack_a730;
        auVar88._24_8_ = uStack_a728;
        auVar88._32_8_ = uStack_a720;
        auVar88._40_8_ = uStack_a718;
        auVar88._48_8_ = uStack_a710;
        auVar88._56_8_ = uStack_a708;
        auVar82 = vmulps_avx512f(auVar86,auVar88);
        uVar66 = local_a960;
        uVar55 = local_a968;
        while (uVar66 != 0) {
          uVar61 = (ulong)*(uint *)(lVar60 + 0x30 + lVar64 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar2[2].numPrimitives +
                               (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          auVar126 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                (long)*(int *)(local_a940 + uVar55 * 4) * 0x38) + uVar61 * 4);
          *(int *)((long)&local_a700 + uVar55 * 4) = auVar69._0_4_;
          uVar1 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x40) = uVar1;
          uVar1 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&local_a700 + uVar55 * 4 + 0x80) = uVar1;
          *(int *)((long)&local_a7c0 + uVar55 * 4) = auVar126._0_4_;
          uVar1 = vextractps_avx(auVar126,1);
          *(undefined4 *)((long)&local_a780 + uVar55 * 4) = uVar1;
          uVar1 = vextractps_avx(auVar126,2);
          *(undefined4 *)((long)&local_a740 + uVar55 * 4) = uVar1;
          uVar61 = uVar55 & 0x3f;
          uVar55 = 0;
          uVar66 = uVar66 ^ 1L << uVar61;
          for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            uVar55 = uVar55 + 1;
          }
        }
        auVar80 = vaddps_avx512f(auVar89,auVar80);
        auVar83 = vmulps_avx512f(auVar81,auVar83);
        local_9f00 = vaddps_avx512f(auVar83,auVar104);
        auVar83 = vmulps_avx512f(auVar81,auVar105);
        auVar104 = vmulps_avx512f(auVar81,auVar87);
        local_a340 = vaddps_avx512f(auVar104,auVar82);
        auVar77 = vmulps_avx512f(auVar86,auVar77);
        auVar82 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.x.field_0);
        auVar104 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.y.field_0);
        local_a380 = vaddps_avx512f(auVar83,auVar77);
        auVar87 = vmulps_avx512f(auVar81,(undefined1  [64])local_a700.field_0.z.field_0);
        auVar81._8_8_ = uStack_a7b8;
        auVar81._0_8_ = local_a7c0;
        auVar81._16_8_ = uStack_a7b0;
        auVar81._24_8_ = uStack_a7a8;
        auVar81._32_8_ = uStack_a7a0;
        auVar81._40_8_ = uStack_a798;
        auVar81._48_8_ = uStack_a790;
        auVar81._56_8_ = uStack_a788;
        auVar77 = vmulps_avx512f(auVar86,auVar81);
        auVar77 = vaddps_avx512f(auVar82,auVar77);
        auVar83._8_8_ = uStack_a778;
        auVar83._0_8_ = local_a780;
        auVar83._16_8_ = uStack_a770;
        auVar83._24_8_ = uStack_a768;
        auVar83._32_8_ = uStack_a760;
        auVar83._40_8_ = uStack_a758;
        auVar83._48_8_ = uStack_a750;
        auVar83._56_8_ = uStack_a748;
        auVar81 = vmulps_avx512f(auVar86,auVar83);
        local_9f40 = vaddps_avx512f(auVar104,auVar81);
        auVar105._8_8_ = uStack_a738;
        auVar105._0_8_ = local_a740;
        auVar105._16_8_ = uStack_a730;
        auVar105._24_8_ = uStack_a728;
        auVar105._32_8_ = uStack_a720;
        auVar105._40_8_ = uStack_a718;
        auVar105._48_8_ = uStack_a710;
        auVar105._56_8_ = uStack_a708;
        auVar86 = vmulps_avx512f(auVar86,auVar105);
        local_a880 = vaddps_avx512f(auVar87,auVar86);
      }
      auVar86 = *(undefined1 (*) [64])ray;
      auVar81 = *(undefined1 (*) [64])(ray + 0x40);
      auVar82 = *(undefined1 (*) [64])(ray + 0x80);
      auVar83 = *(undefined1 (*) [64])(ray + 0x100);
      auVar104 = *(undefined1 (*) [64])(ray + 0x140);
      auVar105 = *(undefined1 (*) [64])(ray + 0x180);
      auVar78 = vsubps_avx512f(auVar78,auVar86);
      auVar79 = vsubps_avx512f(auVar79,auVar81);
      auVar80 = vsubps_avx512f(auVar80,auVar82);
      local_9ec0 = auVar76;
      auVar76 = vsubps_avx512f(auVar76,auVar86);
      local_a480 = auVar84;
      auVar84 = vsubps_avx512f(auVar84,auVar81);
      auVar87 = vsubps_avx512f(local_9f00,auVar82);
      auVar86 = vsubps_avx512f(auVar77,auVar86);
      auVar81 = vsubps_avx512f(local_9f40,auVar81);
      auVar82 = vsubps_avx512f(local_a880,auVar82);
      auVar88 = vsubps_avx512f(auVar86,auVar78);
      auVar89 = vsubps_avx512f(auVar81,auVar79);
      auVar90 = vsubps_avx512f(auVar82,auVar80);
      auVar91 = vsubps_avx512f(auVar78,auVar76);
      auVar92 = vsubps_avx512f(auVar79,auVar84);
      auVar93 = vsubps_avx512f(auVar80,auVar87);
      auVar94 = vaddps_avx512f(auVar86,auVar78);
      auVar95 = vaddps_avx512f(auVar81,auVar79);
      auVar96 = vaddps_avx512f(auVar82,auVar80);
      auVar97 = vmulps_avx512f(auVar95,auVar90);
      auVar97 = vfmsub231ps_avx512f(auVar97,auVar89,auVar96);
      auVar96 = vmulps_avx512f(auVar96,auVar88);
      auVar96 = vfmsub231ps_avx512f(auVar96,auVar90,auVar94);
      auVar94 = vmulps_avx512f(auVar94,auVar89);
      auVar94 = vfmsub231ps_avx512f(auVar94,auVar88,auVar95);
      auVar94 = vmulps_avx512f(auVar94,auVar105);
      auVar94 = vfmadd231ps_avx512f(auVar94,auVar104,auVar96);
      auVar94 = vfmadd231ps_avx512f(auVar94,auVar83,auVar97);
      auVar95 = vaddps_avx512f(auVar78,auVar76);
      auVar96 = vaddps_avx512f(auVar79,auVar84);
      auVar97 = vaddps_avx512f(auVar80,auVar87);
      auVar98 = vmulps_avx512f(auVar96,auVar93);
      auVar98 = vfmsub231ps_avx512f(auVar98,auVar92,auVar97);
      auVar97 = vmulps_avx512f(auVar97,auVar91);
      auVar97 = vfmsub231ps_avx512f(auVar97,auVar93,auVar95);
      auVar95 = vmulps_avx512f(auVar95,auVar92);
      auVar95 = vfmsub231ps_avx512f(auVar95,auVar91,auVar96);
      auVar96 = vsubps_avx512f(auVar76,auVar86);
      auVar95 = vmulps_avx512f(auVar95,auVar105);
      auVar95 = vfmadd231ps_avx512f(auVar95,auVar104,auVar97);
      auVar97 = vsubps_avx512f(auVar84,auVar81);
      auVar95 = vfmadd231ps_avx512f(auVar95,auVar83,auVar98);
      auVar98 = vsubps_avx512f(auVar87,auVar82);
      auVar76 = vaddps_avx512f(auVar76,auVar86);
      auVar86 = vaddps_avx512f(auVar84,auVar81);
      auVar81 = vaddps_avx512f(auVar87,auVar82);
      auVar82 = vmulps_avx512f(auVar86,auVar98);
      auVar82 = vfmsub231ps_avx512f(auVar82,auVar97,auVar81);
      auVar81 = vmulps_avx512f(auVar81,auVar96);
      auVar81 = vfmsub231ps_avx512f(auVar81,auVar98,auVar76);
      auVar76 = vmulps_avx512f(auVar76,auVar97);
      auVar76 = vfmsub231ps_avx512f(auVar76,auVar96,auVar86);
      auVar76 = vmulps_avx512f(auVar76,auVar105);
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar104,auVar81);
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar83,auVar82);
      auVar86 = vaddps_avx512f(auVar94,auVar95);
      auVar86 = vaddps_avx512f(auVar76,auVar86);
      auVar81 = vandps_avx512dq(auVar86,auVar71);
      auVar45._8_4_ = 0x34000000;
      auVar45._0_8_ = 0x3400000034000000;
      auVar45._12_4_ = 0x34000000;
      auVar45._16_4_ = 0x34000000;
      auVar45._20_4_ = 0x34000000;
      auVar45._24_4_ = 0x34000000;
      auVar45._28_4_ = 0x34000000;
      auVar45._32_4_ = 0x34000000;
      auVar45._36_4_ = 0x34000000;
      auVar45._40_4_ = 0x34000000;
      auVar45._44_4_ = 0x34000000;
      auVar45._48_4_ = 0x34000000;
      auVar45._52_4_ = 0x34000000;
      auVar45._56_4_ = 0x34000000;
      auVar45._60_4_ = 0x34000000;
      auVar82 = vmulps_avx512f(auVar81,auVar45);
      auVar84 = vminps_avx512f(auVar94,auVar95);
      auVar84 = vminps_avx512f(auVar84,auVar76);
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      auVar46._16_4_ = 0x80000000;
      auVar46._20_4_ = 0x80000000;
      auVar46._24_4_ = 0x80000000;
      auVar46._28_4_ = 0x80000000;
      auVar46._32_4_ = 0x80000000;
      auVar46._36_4_ = 0x80000000;
      auVar46._40_4_ = 0x80000000;
      auVar46._44_4_ = 0x80000000;
      auVar46._48_4_ = 0x80000000;
      auVar46._52_4_ = 0x80000000;
      auVar46._56_4_ = 0x80000000;
      auVar46._60_4_ = 0x80000000;
      auVar87 = vxorps_avx512dq(auVar82,auVar46);
      uVar24 = vcmpps_avx512f(auVar84,auVar87,5);
      auVar84 = vmaxps_avx512f(auVar94,auVar95);
      auVar76 = vmaxps_avx512f(auVar84,auVar76);
      uVar25 = vcmpps_avx512f(auVar76,auVar82,2);
      uVar63 = ((ushort)uVar24 | (ushort)uVar25) & (ushort)uVar56;
      if (uVar63 != 0) {
        local_a800 = auVar77;
        auVar76 = vmulps_avx512f(auVar92,auVar90);
        auVar82 = vmulps_avx512f(auVar88,auVar93);
        auVar84 = vmulps_avx512f(auVar91,auVar89);
        auVar87 = vmulps_avx512f(auVar97,auVar93);
        auVar99 = vmulps_avx512f(auVar91,auVar98);
        auVar100 = vmulps_avx512f(auVar96,auVar92);
        auVar89 = vfmsub213ps_avx512f(auVar89,auVar93,auVar76);
        auVar90 = vfmsub213ps_avx512f(auVar90,auVar91,auVar82);
        auVar88 = vfmsub213ps_avx512f(auVar88,auVar92,auVar84);
        auVar92 = vfmsub213ps_avx512f(auVar98,auVar92,auVar87);
        auVar93 = vfmsub213ps_avx512f(auVar96,auVar93,auVar99);
        auVar91 = vfmsub213ps_avx512f(auVar97,auVar91,auVar100);
        auVar76 = vandps_avx512dq(auVar76,auVar71);
        auVar87 = vandps_avx512dq(auVar87,auVar71);
        uVar55 = vcmpps_avx512f(auVar76,auVar87,1);
        auVar76 = vandps_avx512dq(auVar82,auVar71);
        auVar82 = vandps_avx512dq(auVar99,auVar71);
        uVar66 = vcmpps_avx512f(auVar76,auVar82,1);
        auVar76 = vandps_avx512dq(auVar84,auVar71);
        auVar82 = vandps_avx512dq(auVar100,auVar71);
        uVar61 = vcmpps_avx512f(auVar76,auVar82,1);
        bVar54 = (bool)((byte)uVar55 & 1);
        vVar101.field_0._0_4_ = (uint)bVar54 * auVar89._0_4_ | (uint)!bVar54 * auVar92._0_4_;
        bVar54 = (bool)((byte)(uVar55 >> 1) & 1);
        vVar101.field_0._4_4_ = (uint)bVar54 * auVar89._4_4_ | (uint)!bVar54 * auVar92._4_4_;
        bVar54 = (bool)((byte)(uVar55 >> 2) & 1);
        vVar101.field_0._8_4_ = (uint)bVar54 * auVar89._8_4_ | (uint)!bVar54 * auVar92._8_4_;
        bVar54 = (bool)((byte)(uVar55 >> 3) & 1);
        vVar101.field_0._12_4_ = (uint)bVar54 * auVar89._12_4_ | (uint)!bVar54 * auVar92._12_4_;
        bVar54 = (bool)((byte)(uVar55 >> 4) & 1);
        vVar101.field_0._16_4_ = (uint)bVar54 * auVar89._16_4_ | (uint)!bVar54 * auVar92._16_4_;
        bVar54 = (bool)((byte)(uVar55 >> 5) & 1);
        vVar101.field_0._20_4_ = (uint)bVar54 * auVar89._20_4_ | (uint)!bVar54 * auVar92._20_4_;
        bVar54 = (bool)((byte)(uVar55 >> 6) & 1);
        vVar101.field_0._24_4_ = (uint)bVar54 * auVar89._24_4_ | (uint)!bVar54 * auVar92._24_4_;
        bVar54 = (bool)((byte)(uVar55 >> 7) & 1);
        vVar101.field_0._28_4_ = (uint)bVar54 * auVar89._28_4_ | (uint)!bVar54 * auVar92._28_4_;
        bVar54 = (bool)((byte)(uVar55 >> 8) & 1);
        vVar101.field_0._32_4_ = (uint)bVar54 * auVar89._32_4_ | (uint)!bVar54 * auVar92._32_4_;
        bVar54 = (bool)((byte)(uVar55 >> 9) & 1);
        vVar101.field_0._36_4_ = (uint)bVar54 * auVar89._36_4_ | (uint)!bVar54 * auVar92._36_4_;
        bVar54 = (bool)((byte)(uVar55 >> 10) & 1);
        vVar101.field_0._40_4_ = (uint)bVar54 * auVar89._40_4_ | (uint)!bVar54 * auVar92._40_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xb) & 1);
        vVar101.field_0._44_4_ = (uint)bVar54 * auVar89._44_4_ | (uint)!bVar54 * auVar92._44_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xc) & 1);
        vVar101.field_0._48_4_ = (uint)bVar54 * auVar89._48_4_ | (uint)!bVar54 * auVar92._48_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xd) & 1);
        vVar101.field_0._52_4_ = (uint)bVar54 * auVar89._52_4_ | (uint)!bVar54 * auVar92._52_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xe) & 1);
        vVar101.field_0._56_4_ = (uint)bVar54 * auVar89._56_4_ | (uint)!bVar54 * auVar92._56_4_;
        bVar54 = SUB81(uVar55 >> 0xf,0);
        vVar101.field_0._60_4_ = (uint)bVar54 * auVar89._60_4_ | (uint)!bVar54 * auVar92._60_4_;
        bVar54 = (bool)((byte)uVar66 & 1);
        vVar102.field_0._0_4_ = (uint)bVar54 * auVar90._0_4_ | (uint)!bVar54 * auVar93._0_4_;
        bVar54 = (bool)((byte)(uVar66 >> 1) & 1);
        vVar102.field_0._4_4_ = (uint)bVar54 * auVar90._4_4_ | (uint)!bVar54 * auVar93._4_4_;
        bVar54 = (bool)((byte)(uVar66 >> 2) & 1);
        vVar102.field_0._8_4_ = (uint)bVar54 * auVar90._8_4_ | (uint)!bVar54 * auVar93._8_4_;
        bVar54 = (bool)((byte)(uVar66 >> 3) & 1);
        vVar102.field_0._12_4_ = (uint)bVar54 * auVar90._12_4_ | (uint)!bVar54 * auVar93._12_4_;
        bVar54 = (bool)((byte)(uVar66 >> 4) & 1);
        vVar102.field_0._16_4_ = (uint)bVar54 * auVar90._16_4_ | (uint)!bVar54 * auVar93._16_4_;
        bVar54 = (bool)((byte)(uVar66 >> 5) & 1);
        vVar102.field_0._20_4_ = (uint)bVar54 * auVar90._20_4_ | (uint)!bVar54 * auVar93._20_4_;
        bVar54 = (bool)((byte)(uVar66 >> 6) & 1);
        vVar102.field_0._24_4_ = (uint)bVar54 * auVar90._24_4_ | (uint)!bVar54 * auVar93._24_4_;
        bVar54 = (bool)((byte)(uVar66 >> 7) & 1);
        vVar102.field_0._28_4_ = (uint)bVar54 * auVar90._28_4_ | (uint)!bVar54 * auVar93._28_4_;
        bVar54 = (bool)((byte)(uVar66 >> 8) & 1);
        vVar102.field_0._32_4_ = (uint)bVar54 * auVar90._32_4_ | (uint)!bVar54 * auVar93._32_4_;
        bVar54 = (bool)((byte)(uVar66 >> 9) & 1);
        vVar102.field_0._36_4_ = (uint)bVar54 * auVar90._36_4_ | (uint)!bVar54 * auVar93._36_4_;
        bVar54 = (bool)((byte)(uVar66 >> 10) & 1);
        vVar102.field_0._40_4_ = (uint)bVar54 * auVar90._40_4_ | (uint)!bVar54 * auVar93._40_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xb) & 1);
        vVar102.field_0._44_4_ = (uint)bVar54 * auVar90._44_4_ | (uint)!bVar54 * auVar93._44_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xc) & 1);
        vVar102.field_0._48_4_ = (uint)bVar54 * auVar90._48_4_ | (uint)!bVar54 * auVar93._48_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xd) & 1);
        vVar102.field_0._52_4_ = (uint)bVar54 * auVar90._52_4_ | (uint)!bVar54 * auVar93._52_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xe) & 1);
        vVar102.field_0._56_4_ = (uint)bVar54 * auVar90._56_4_ | (uint)!bVar54 * auVar93._56_4_;
        bVar54 = SUB81(uVar66 >> 0xf,0);
        vVar102.field_0._60_4_ = (uint)bVar54 * auVar90._60_4_ | (uint)!bVar54 * auVar93._60_4_;
        bVar54 = (bool)((byte)uVar61 & 1);
        vVar103.field_0._0_4_ = (uint)bVar54 * auVar88._0_4_ | (uint)!bVar54 * auVar91._0_4_;
        bVar54 = (bool)((byte)(uVar61 >> 1) & 1);
        vVar103.field_0._4_4_ = (uint)bVar54 * auVar88._4_4_ | (uint)!bVar54 * auVar91._4_4_;
        bVar54 = (bool)((byte)(uVar61 >> 2) & 1);
        vVar103.field_0._8_4_ = (uint)bVar54 * auVar88._8_4_ | (uint)!bVar54 * auVar91._8_4_;
        bVar54 = (bool)((byte)(uVar61 >> 3) & 1);
        vVar103.field_0._12_4_ = (uint)bVar54 * auVar88._12_4_ | (uint)!bVar54 * auVar91._12_4_;
        bVar54 = (bool)((byte)(uVar61 >> 4) & 1);
        vVar103.field_0._16_4_ = (uint)bVar54 * auVar88._16_4_ | (uint)!bVar54 * auVar91._16_4_;
        bVar54 = (bool)((byte)(uVar61 >> 5) & 1);
        vVar103.field_0._20_4_ = (uint)bVar54 * auVar88._20_4_ | (uint)!bVar54 * auVar91._20_4_;
        bVar54 = (bool)((byte)(uVar61 >> 6) & 1);
        vVar103.field_0._24_4_ = (uint)bVar54 * auVar88._24_4_ | (uint)!bVar54 * auVar91._24_4_;
        bVar54 = (bool)((byte)(uVar61 >> 7) & 1);
        vVar103.field_0._28_4_ = (uint)bVar54 * auVar88._28_4_ | (uint)!bVar54 * auVar91._28_4_;
        bVar54 = (bool)((byte)(uVar61 >> 8) & 1);
        vVar103.field_0._32_4_ = (uint)bVar54 * auVar88._32_4_ | (uint)!bVar54 * auVar91._32_4_;
        bVar54 = (bool)((byte)(uVar61 >> 9) & 1);
        vVar103.field_0._36_4_ = (uint)bVar54 * auVar88._36_4_ | (uint)!bVar54 * auVar91._36_4_;
        bVar54 = (bool)((byte)(uVar61 >> 10) & 1);
        vVar103.field_0._40_4_ = (uint)bVar54 * auVar88._40_4_ | (uint)!bVar54 * auVar91._40_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xb) & 1);
        vVar103.field_0._44_4_ = (uint)bVar54 * auVar88._44_4_ | (uint)!bVar54 * auVar91._44_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xc) & 1);
        vVar103.field_0._48_4_ = (uint)bVar54 * auVar88._48_4_ | (uint)!bVar54 * auVar91._48_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xd) & 1);
        vVar103.field_0._52_4_ = (uint)bVar54 * auVar88._52_4_ | (uint)!bVar54 * auVar91._52_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xe) & 1);
        vVar103.field_0._56_4_ = (uint)bVar54 * auVar88._56_4_ | (uint)!bVar54 * auVar91._56_4_;
        bVar54 = SUB81(uVar61 >> 0xf,0);
        vVar103.field_0._60_4_ = (uint)bVar54 * auVar88._60_4_ | (uint)!bVar54 * auVar91._60_4_;
        auVar76 = vmulps_avx512f(auVar105,(undefined1  [64])vVar103.field_0);
        auVar76 = vfmadd213ps_avx512f(auVar104,(undefined1  [64])vVar102.field_0,auVar76);
        auVar76 = vfmadd213ps_avx512f(auVar83,(undefined1  [64])vVar101.field_0,auVar76);
        auVar76 = vaddps_avx512f(auVar76,auVar76);
        auVar80 = vmulps_avx512f(auVar80,(undefined1  [64])vVar103.field_0);
        auVar79 = vfmadd213ps_avx512f(auVar79,(undefined1  [64])vVar102.field_0,auVar80);
        auVar78 = vfmadd213ps_avx512f(auVar78,(undefined1  [64])vVar101.field_0,auVar79);
        auVar79 = vrcp14ps_avx512f(auVar76);
        auVar78 = vaddps_avx512f(auVar78,auVar78);
        auVar80 = vfnmadd213ps_avx512f(auVar79,auVar76,auVar73);
        auVar79 = vfmadd132ps_avx512f(auVar80,auVar79,auVar79);
        local_a640 = vmulps_avx512f(auVar78,auVar79);
        uVar24 = vcmpps_avx512f(local_a640,*(undefined1 (*) [64])(ray + 0x200),2);
        uVar25 = vcmpps_avx512f(local_a640,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar26 = vcmpps_avx512f(auVar76,auVar74,4);
        uVar63 = uVar63 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26;
        if (uVar63 != 0) {
          auVar76 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
          uVar24 = vptestmd_avx512f(auVar76,*(undefined1 (*) [64])(ray + 0x240));
          uVar63 = uVar63 & (ushort)uVar24;
          auVar77 = local_a800;
          if (uVar63 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar70 = vrcp14ps_avx512f(auVar86);
              auVar127._8_4_ = 0x219392ef;
              auVar127._0_8_ = 0x219392ef219392ef;
              auVar127._12_4_ = 0x219392ef;
              auVar127._16_4_ = 0x219392ef;
              auVar127._20_4_ = 0x219392ef;
              auVar127._24_4_ = 0x219392ef;
              auVar127._28_4_ = 0x219392ef;
              auVar127._32_4_ = 0x219392ef;
              auVar127._36_4_ = 0x219392ef;
              auVar127._40_4_ = 0x219392ef;
              auVar127._44_4_ = 0x219392ef;
              auVar127._48_4_ = 0x219392ef;
              auVar127._52_4_ = 0x219392ef;
              auVar127._56_4_ = 0x219392ef;
              auVar127._60_4_ = 0x219392ef;
              uVar56 = vcmpps_avx512f(auVar81,auVar127,5);
              auVar127 = vfnmadd213ps_avx512f(auVar86,auVar70,auVar73);
              auVar70 = vfmadd132ps_avx512f(auVar127,auVar70,auVar70);
              auVar71._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * auVar70._4_4_;
              auVar71._0_4_ = (uint)((byte)uVar56 & 1) * auVar70._0_4_;
              auVar71._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * auVar70._8_4_;
              auVar71._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * auVar70._12_4_;
              auVar71._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar70._16_4_;
              auVar71._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar70._20_4_;
              auVar71._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar70._24_4_;
              auVar71._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * auVar70._28_4_;
              auVar71._32_4_ = (uint)((byte)(uVar56 >> 8) & 1) * auVar70._32_4_;
              auVar71._36_4_ = (uint)((byte)(uVar56 >> 9) & 1) * auVar70._36_4_;
              auVar71._40_4_ = (uint)((byte)(uVar56 >> 10) & 1) * auVar70._40_4_;
              auVar71._44_4_ = (uint)((byte)(uVar56 >> 0xb) & 1) * auVar70._44_4_;
              auVar71._48_4_ = (uint)((byte)(uVar56 >> 0xc) & 1) * auVar70._48_4_;
              auVar71._52_4_ = (uint)((byte)(uVar56 >> 0xd) & 1) * auVar70._52_4_;
              auVar71._56_4_ = (uint)((byte)(uVar56 >> 0xe) & 1) * auVar70._56_4_;
              auVar71._60_4_ = (uint)(byte)(uVar56 >> 0xf) * auVar70._60_4_;
              auVar70 = vmulps_avx512f(auVar94,auVar71);
              local_a5c0 = vminps_avx512f(auVar70,auVar73);
              auVar70 = vmulps_avx512f(auVar95,auVar71);
              local_a600 = vminps_avx512f(auVar70,auVar73);
              local_a940._8_8_ = (vfloat_impl<16> *)local_a440;
              local_a940._0_8_ = &local_a7c0;
              _Stack_a930._M_head_impl = (vfloat_impl<16> *)local_a400;
              auStack_a920 = auVar75._32_32_;
              _Stack_a928._M_head_impl = (vfloat_impl<16> *)local_a3c0;
              local_a8e0 = pGVar2;
              local_a700.field_0.x.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar101.field_0;
              local_a700.field_0.y.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar102.field_0;
              local_a700.field_0.z.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar103.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
              ::
              _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                          *)local_a940,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                          *)&local_a700.field_0);
              pRVar4 = context->user;
              auVar70 = vpbroadcastd_avx512f();
              auVar127 = vpbroadcastd_avx512f();
              local_a700._8_8_ = uStack_a7b8;
              local_a700._0_8_ = local_a7c0;
              local_a700._16_8_ = uStack_a7b0;
              local_a700._24_8_ = uStack_a7a8;
              local_a700._32_8_ = uStack_a7a0;
              local_a700._40_8_ = uStack_a798;
              local_a700._48_8_ = uStack_a790;
              local_a700._56_8_ = uStack_a788;
              local_a700._72_8_ = uStack_a778;
              local_a700._64_8_ = local_a780;
              local_a700._80_8_ = uStack_a770;
              local_a700._88_8_ = uStack_a768;
              local_a700._96_8_ = uStack_a760;
              local_a700._104_8_ = uStack_a758;
              local_a700._112_8_ = uStack_a750;
              local_a700._120_8_ = uStack_a748;
              local_a700._136_8_ = uStack_a738;
              local_a700._128_8_ = local_a740;
              local_a700._144_8_ = uStack_a730;
              local_a700._152_8_ = uStack_a728;
              local_a700._160_8_ = uStack_a720;
              local_a700._168_8_ = uStack_a718;
              local_a700._176_8_ = uStack_a710;
              local_a700._184_8_ = uStack_a708;
              local_a5c0 = vmovdqa64_avx512f(auVar127);
              local_a580 = vmovdqa64_avx512f(auVar70);
              auVar22 = vpcmpeqd_avx2(auVar70._0_32_,auVar70._0_32_);
              local_a8d8[3] = auVar22;
              local_a8d8[2] = auVar22;
              local_a8d8[1] = auVar22;
              *local_a8d8 = auVar22;
              local_a540 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
              local_a500 = vbroadcastss_avx512f(ZEXT416(pRVar4->instPrimID[0]));
              local_a4c0 = *(undefined1 (*) [64])(ray + 0x200);
              auVar70 = vblendmps_avx512f(local_a4c0,local_a440);
              bVar54 = (bool)((byte)uVar63 & 1);
              bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
              bVar12 = (bool)((byte)(uVar63 >> 7) & 1);
              bVar13 = (byte)(uVar63 >> 8);
              bVar14 = (bool)(bVar13 >> 1 & 1);
              bVar15 = (bool)(bVar13 >> 2 & 1);
              bVar16 = (bool)(bVar13 >> 3 & 1);
              bVar17 = (bool)(bVar13 >> 4 & 1);
              bVar18 = (bool)(bVar13 >> 5 & 1);
              bVar19 = (bool)(bVar13 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar54 * auVar70._0_4_ | (uint)!bVar54 * local_a500._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar6 * auVar70._4_4_ | (uint)!bVar6 * local_a500._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * local_a500._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar8 * auVar70._12_4_ | (uint)!bVar8 * local_a500._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar9 * auVar70._16_4_ | (uint)!bVar9 * local_a500._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar10 * auVar70._20_4_ | (uint)!bVar10 * local_a500._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar11 * auVar70._24_4_ | (uint)!bVar11 * local_a500._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * local_a500._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar13 & 1) * auVar70._32_4_ |
                   (uint)!(bool)(bVar13 & 1) * local_a500._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar14 * auVar70._36_4_ | (uint)!bVar14 * local_a500._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar15 * auVar70._40_4_ | (uint)!bVar15 * local_a500._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar16 * auVar70._44_4_ | (uint)!bVar16 * local_a500._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar17 * auVar70._48_4_ | (uint)!bVar17 * local_a500._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar18 * auVar70._52_4_ | (uint)!bVar18 * local_a500._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar19 * auVar70._56_4_ | (uint)!bVar19 * local_a500._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar63 >> 0xf) * auVar70._60_4_ |
                   (uint)!(bool)(bVar13 >> 7) * local_a500._60_4_;
              auVar75 = vpmovm2d_avx512dq((ulong)uVar63);
              _local_a940 = vmovdqa64_avx512f(auVar75);
              local_a8d0.valid = (int *)local_a940;
              local_a8d0.geometryUserPtr = local_a8e0->userPtr;
              local_a8d0.context = context->user;
              local_a8d0.ray = (RTCRayN *)ray;
              local_a8d0.hit = (RTCHitN *)&local_a700;
              local_a8d0.N = 0x10;
              if (local_a8e0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_a8e0->occlusionFilterN)(&local_a8d0);
                auVar75 = vmovdqa64_avx512f(_local_a940);
              }
              uVar24 = vptestmd_avx512f(auVar75,auVar75);
              if ((short)uVar24 == 0) {
                uVar56 = 0;
                auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                auVar74 = ZEXT1664(auVar68);
                uVar57 = local_a840._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                  auVar74 = ZEXT1664(auVar68);
                }
                else {
                  auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                  auVar74 = ZEXT1664(auVar68);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((local_a8e0->field_8).field_0x2 & 0x40) != 0)) {
                    (*p_Var5)(&local_a8d0);
                    auVar68 = vxorps_avx512vl(auVar68,auVar68);
                    auVar74 = ZEXT1664(auVar68);
                    auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                    auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                    auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                    auVar75 = vmovdqa64_avx512f(_local_a940);
                  }
                }
                uVar56 = vptestmd_avx512f(auVar75,auVar75);
                auVar75 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar54 = (bool)((byte)uVar56 & 1);
                auVar110._0_4_ =
                     (uint)bVar54 * auVar75._0_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x200)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
                auVar110._4_4_ =
                     (uint)bVar54 * auVar75._4_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x204)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
                auVar110._8_4_ =
                     (uint)bVar54 * auVar75._8_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x208)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar54 * auVar75._12_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x20c);
                bVar54 = (bool)((byte)(uVar56 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar54 * auVar75._16_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x210);
                bVar54 = (bool)((byte)(uVar56 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar54 * auVar75._20_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x214);
                bVar54 = (bool)((byte)(uVar56 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar54 * auVar75._24_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x218);
                bVar54 = (bool)((byte)(uVar56 >> 7) & 1);
                auVar110._28_4_ =
                     (uint)bVar54 * auVar75._28_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x21c);
                bVar54 = (bool)((byte)(uVar56 >> 8) & 1);
                auVar110._32_4_ =
                     (uint)bVar54 * auVar75._32_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x220);
                bVar54 = (bool)((byte)(uVar56 >> 9) & 1);
                auVar110._36_4_ =
                     (uint)bVar54 * auVar75._36_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x224);
                bVar54 = (bool)((byte)(uVar56 >> 10) & 1);
                auVar110._40_4_ =
                     (uint)bVar54 * auVar75._40_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x228);
                bVar54 = (bool)((byte)(uVar56 >> 0xb) & 1);
                auVar110._44_4_ =
                     (uint)bVar54 * auVar75._44_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x22c);
                bVar54 = (bool)((byte)(uVar56 >> 0xc) & 1);
                auVar110._48_4_ =
                     (uint)bVar54 * auVar75._48_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x230);
                bVar54 = (bool)((byte)(uVar56 >> 0xd) & 1);
                auVar110._52_4_ =
                     (uint)bVar54 * auVar75._52_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x234);
                bVar54 = (bool)((byte)(uVar56 >> 0xe) & 1);
                auVar110._56_4_ =
                     (uint)bVar54 * auVar75._56_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x238);
                bVar54 = SUB81(uVar56 >> 0xf,0);
                auVar110._60_4_ =
                     (uint)bVar54 * auVar75._60_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x23c);
                *(undefined1 (*) [64])(local_a8d0.ray + 0x200) = auVar110;
                uVar57 = local_a840._0_4_;
              }
              uVar63 = (ushort)uVar56;
              bVar54 = (bool)((byte)uVar56 & 1);
              bVar6 = (bool)((byte)(uVar56 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar56 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar56 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar56 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar56 >> 6) & 1);
              bVar12 = (bool)((byte)(uVar56 >> 7) & 1);
              bVar14 = (bool)((byte)(uVar56 >> 8) & 1);
              bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
              bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
              bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
              bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
              bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
              bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
              bVar21 = SUB81(uVar56 >> 0xf,0);
              *(uint *)local_a958 =
                   (uint)bVar54 * *(int *)local_a958 | (uint)!bVar54 * local_a4c0._0_4_;
              *(uint *)(local_a958 + 4) =
                   (uint)bVar6 * *(int *)(local_a958 + 4) | (uint)!bVar6 * local_a4c0._4_4_;
              *(uint *)(local_a958 + 8) =
                   (uint)bVar7 * *(int *)(local_a958 + 8) | (uint)!bVar7 * local_a4c0._8_4_;
              *(uint *)(local_a958 + 0xc) =
                   (uint)bVar8 * *(int *)(local_a958 + 0xc) | (uint)!bVar8 * local_a4c0._12_4_;
              *(uint *)(local_a958 + 0x10) =
                   (uint)bVar9 * *(int *)(local_a958 + 0x10) | (uint)!bVar9 * local_a4c0._16_4_;
              *(uint *)(local_a958 + 0x14) =
                   (uint)bVar10 * *(int *)(local_a958 + 0x14) | (uint)!bVar10 * local_a4c0._20_4_;
              *(uint *)(local_a958 + 0x18) =
                   (uint)bVar11 * *(int *)(local_a958 + 0x18) | (uint)!bVar11 * local_a4c0._24_4_;
              *(uint *)(local_a958 + 0x1c) =
                   (uint)bVar12 * *(int *)(local_a958 + 0x1c) | (uint)!bVar12 * local_a4c0._28_4_;
              *(uint *)(local_a958 + 0x20) =
                   (uint)bVar14 * *(int *)(local_a958 + 0x20) | (uint)!bVar14 * local_a4c0._32_4_;
              *(uint *)(local_a958 + 0x24) =
                   (uint)bVar15 * *(int *)(local_a958 + 0x24) | (uint)!bVar15 * local_a4c0._36_4_;
              *(uint *)(local_a958 + 0x28) =
                   (uint)bVar16 * *(int *)(local_a958 + 0x28) | (uint)!bVar16 * local_a4c0._40_4_;
              *(uint *)(local_a958 + 0x2c) =
                   (uint)bVar17 * *(int *)(local_a958 + 0x2c) | (uint)!bVar17 * local_a4c0._44_4_;
              *(uint *)(local_a958 + 0x30) =
                   (uint)bVar18 * *(int *)(local_a958 + 0x30) | (uint)!bVar18 * local_a4c0._48_4_;
              *(uint *)(local_a958 + 0x34) =
                   (uint)bVar19 * *(int *)(local_a958 + 0x34) | (uint)!bVar19 * local_a4c0._52_4_;
              *(uint *)(local_a958 + 0x38) =
                   (uint)bVar20 * *(int *)(local_a958 + 0x38) | (uint)!bVar20 * local_a4c0._56_4_;
              *(uint *)(local_a958 + 0x3c) =
                   (uint)bVar21 * *(int *)(local_a958 + 0x3c) | (uint)!bVar21 * local_a4c0._60_4_;
            }
            uVar56 = (ulong)(uVar57 & (ushort)~uVar63);
            auVar77 = local_a800;
          }
        }
      }
      auVar75 = _local_a940;
      uVar57 = (uint)uVar56;
      if ((ushort)uVar56 == 0) break;
      auVar74 = *(undefined1 (*) [64])ray;
      auVar76 = *(undefined1 (*) [64])(ray + 0x40);
      auVar86 = *(undefined1 (*) [64])(ray + 0x80);
      auVar78 = *(undefined1 (*) [64])(ray + 0x100);
      auVar79 = *(undefined1 (*) [64])(ray + 0x140);
      auVar80 = *(undefined1 (*) [64])(ray + 0x180);
      auVar81 = vsubps_avx512f(local_a380,auVar74);
      auVar82 = vsubps_avx512f(local_a300,auVar76);
      auVar83 = vsubps_avx512f(local_a340,auVar86);
      auVar77 = vsubps_avx512f(auVar77,auVar74);
      auVar84 = vsubps_avx512f(local_9f40,auVar76);
      auVar104 = vsubps_avx512f(local_a880,auVar86);
      auVar74 = vsubps_avx512f(local_9ec0,auVar74);
      auVar76 = vsubps_avx512f(local_a480,auVar76);
      auVar86 = vsubps_avx512f(local_9f00,auVar86);
      auVar105 = vsubps_avx512f(auVar74,auVar81);
      auVar87 = vsubps_avx512f(auVar76,auVar82);
      auVar88 = vsubps_avx512f(auVar86,auVar83);
      auVar89 = vsubps_avx512f(auVar81,auVar77);
      auVar90 = vsubps_avx512f(auVar82,auVar84);
      auVar91 = vsubps_avx512f(auVar83,auVar104);
      auVar92 = vsubps_avx512f(auVar77,auVar74);
      auVar93 = vsubps_avx512f(auVar84,auVar76);
      auVar94 = vsubps_avx512f(auVar104,auVar86);
      auVar95 = vaddps_avx512f(auVar74,auVar81);
      auVar96 = vaddps_avx512f(auVar76,auVar82);
      auVar97 = vaddps_avx512f(auVar86,auVar83);
      auVar98 = vmulps_avx512f(auVar96,auVar88);
      auVar98 = vfmsub231ps_avx512f(auVar98,auVar87,auVar97);
      auVar97 = vmulps_avx512f(auVar97,auVar105);
      auVar97 = vfmsub231ps_avx512f(auVar97,auVar88,auVar95);
      auVar95 = vmulps_avx512f(auVar95,auVar87);
      auVar95 = vfmsub231ps_avx512f(auVar95,auVar105,auVar96);
      auVar95 = vmulps_avx512f(auVar95,auVar80);
      auVar95 = vfmadd231ps_avx512f(auVar95,auVar79,auVar97);
      auVar95 = vfmadd231ps_avx512f(auVar95,auVar78,auVar98);
      auVar96 = vaddps_avx512f(auVar81,auVar77);
      auVar97 = vaddps_avx512f(auVar82,auVar84);
      auVar98 = vaddps_avx512f(auVar83,auVar104);
      auVar99 = vmulps_avx512f(auVar97,auVar91);
      auVar99 = vfmsub231ps_avx512f(auVar99,auVar90,auVar98);
      auVar98 = vmulps_avx512f(auVar98,auVar89);
      auVar98 = vfmsub231ps_avx512f(auVar98,auVar91,auVar96);
      auVar96 = vmulps_avx512f(auVar96,auVar90);
      auVar96 = vfmsub231ps_avx512f(auVar96,auVar89,auVar97);
      auVar96 = vmulps_avx512f(auVar96,auVar80);
      auVar96 = vfmadd231ps_avx512f(auVar96,auVar79,auVar98);
      auVar96 = vfmadd231ps_avx512f(auVar96,auVar78,auVar99);
      auVar74 = vaddps_avx512f(auVar77,auVar74);
      auVar76 = vaddps_avx512f(auVar84,auVar76);
      auVar86 = vaddps_avx512f(auVar104,auVar86);
      auVar77 = vmulps_avx512f(auVar76,auVar94);
      auVar77 = vfmsub231ps_avx512f(auVar77,auVar93,auVar86);
      auVar86 = vmulps_avx512f(auVar86,auVar92);
      auVar86 = vfmsub231ps_avx512f(auVar86,auVar94,auVar74);
      auVar74 = vmulps_avx512f(auVar74,auVar93);
      auVar74 = vfmsub231ps_avx512f(auVar74,auVar92,auVar76);
      auVar74 = vmulps_avx512f(auVar74,auVar80);
      auVar74 = vfmadd231ps_avx512f(auVar74,auVar79,auVar86);
      auVar74 = vfmadd231ps_avx512f(auVar74,auVar78,auVar77);
      auVar76 = vaddps_avx512f(auVar95,auVar96);
      auVar76 = vaddps_avx512f(auVar74,auVar76);
      auVar86 = vandps_avx512dq(auVar76,auVar71);
      auVar47._8_4_ = 0x34000000;
      auVar47._0_8_ = 0x3400000034000000;
      auVar47._12_4_ = 0x34000000;
      auVar47._16_4_ = 0x34000000;
      auVar47._20_4_ = 0x34000000;
      auVar47._24_4_ = 0x34000000;
      auVar47._28_4_ = 0x34000000;
      auVar47._32_4_ = 0x34000000;
      auVar47._36_4_ = 0x34000000;
      auVar47._40_4_ = 0x34000000;
      auVar47._44_4_ = 0x34000000;
      auVar47._48_4_ = 0x34000000;
      auVar47._52_4_ = 0x34000000;
      auVar47._56_4_ = 0x34000000;
      auVar47._60_4_ = 0x34000000;
      auVar77 = vmulps_avx512f(auVar86,auVar47);
      auVar84 = vminps_avx512f(auVar95,auVar96);
      auVar84 = vminps_avx512f(auVar84,auVar74);
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      auVar48._16_4_ = 0x80000000;
      auVar48._20_4_ = 0x80000000;
      auVar48._24_4_ = 0x80000000;
      auVar48._28_4_ = 0x80000000;
      auVar48._32_4_ = 0x80000000;
      auVar48._36_4_ = 0x80000000;
      auVar48._40_4_ = 0x80000000;
      auVar48._44_4_ = 0x80000000;
      auVar48._48_4_ = 0x80000000;
      auVar48._52_4_ = 0x80000000;
      auVar48._56_4_ = 0x80000000;
      auVar48._60_4_ = 0x80000000;
      auVar104 = vxorps_avx512dq(auVar77,auVar48);
      uVar24 = vcmpps_avx512f(auVar84,auVar104,5);
      auVar84 = vmaxps_avx512f(auVar95,auVar96);
      auVar74 = vmaxps_avx512f(auVar84,auVar74);
      uVar25 = vcmpps_avx512f(auVar74,auVar77,2);
      uVar63 = ((ushort)uVar24 | (ushort)uVar25) & (ushort)uVar56;
      auVar68 = auVar99._0_16_;
      if (uVar63 == 0) {
        auVar68 = vxorps_avx512vl(auVar68,auVar68);
        auVar74 = ZEXT1664(auVar68);
      }
      else {
        auVar74 = vmulps_avx512f(auVar90,auVar88);
        auVar77 = vmulps_avx512f(auVar105,auVar91);
        auVar84 = vmulps_avx512f(auVar89,auVar87);
        auVar104 = vmulps_avx512f(auVar93,auVar91);
        auVar97 = vmulps_avx512f(auVar89,auVar94);
        auVar98 = vmulps_avx512f(auVar92,auVar90);
        auVar87 = vfmsub213ps_avx512f(auVar87,auVar91,auVar74);
        auVar88 = vfmsub213ps_avx512f(auVar88,auVar89,auVar77);
        auVar105 = vfmsub213ps_avx512f(auVar105,auVar90,auVar84);
        auVar90 = vfmsub213ps_avx512f(auVar94,auVar90,auVar104);
        auVar91 = vfmsub213ps_avx512f(auVar92,auVar91,auVar97);
        auVar89 = vfmsub213ps_avx512f(auVar93,auVar89,auVar98);
        auVar74 = vandps_avx512dq(auVar74,auVar71);
        auVar104 = vandps_avx512dq(auVar104,auVar71);
        uVar55 = vcmpps_avx512f(auVar74,auVar104,1);
        auVar74 = vandps_avx512dq(auVar77,auVar71);
        auVar77 = vandps_avx512dq(auVar97,auVar71);
        uVar66 = vcmpps_avx512f(auVar74,auVar77,1);
        auVar74 = vandps_avx512dq(auVar84,auVar71);
        auVar77 = vandps_avx512dq(auVar98,auVar71);
        uVar61 = vcmpps_avx512f(auVar74,auVar77,1);
        bVar54 = (bool)((byte)uVar55 & 1);
        vVar106.field_0._0_4_ = (uint)bVar54 * auVar87._0_4_ | (uint)!bVar54 * auVar90._0_4_;
        bVar54 = (bool)((byte)(uVar55 >> 1) & 1);
        vVar106.field_0._4_4_ = (uint)bVar54 * auVar87._4_4_ | (uint)!bVar54 * auVar90._4_4_;
        bVar54 = (bool)((byte)(uVar55 >> 2) & 1);
        vVar106.field_0._8_4_ = (uint)bVar54 * auVar87._8_4_ | (uint)!bVar54 * auVar90._8_4_;
        bVar54 = (bool)((byte)(uVar55 >> 3) & 1);
        vVar106.field_0._12_4_ = (uint)bVar54 * auVar87._12_4_ | (uint)!bVar54 * auVar90._12_4_;
        bVar54 = (bool)((byte)(uVar55 >> 4) & 1);
        vVar106.field_0._16_4_ = (uint)bVar54 * auVar87._16_4_ | (uint)!bVar54 * auVar90._16_4_;
        bVar54 = (bool)((byte)(uVar55 >> 5) & 1);
        vVar106.field_0._20_4_ = (uint)bVar54 * auVar87._20_4_ | (uint)!bVar54 * auVar90._20_4_;
        bVar54 = (bool)((byte)(uVar55 >> 6) & 1);
        vVar106.field_0._24_4_ = (uint)bVar54 * auVar87._24_4_ | (uint)!bVar54 * auVar90._24_4_;
        bVar54 = (bool)((byte)(uVar55 >> 7) & 1);
        vVar106.field_0._28_4_ = (uint)bVar54 * auVar87._28_4_ | (uint)!bVar54 * auVar90._28_4_;
        bVar54 = (bool)((byte)(uVar55 >> 8) & 1);
        vVar106.field_0._32_4_ = (uint)bVar54 * auVar87._32_4_ | (uint)!bVar54 * auVar90._32_4_;
        bVar54 = (bool)((byte)(uVar55 >> 9) & 1);
        vVar106.field_0._36_4_ = (uint)bVar54 * auVar87._36_4_ | (uint)!bVar54 * auVar90._36_4_;
        bVar54 = (bool)((byte)(uVar55 >> 10) & 1);
        vVar106.field_0._40_4_ = (uint)bVar54 * auVar87._40_4_ | (uint)!bVar54 * auVar90._40_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xb) & 1);
        vVar106.field_0._44_4_ = (uint)bVar54 * auVar87._44_4_ | (uint)!bVar54 * auVar90._44_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xc) & 1);
        vVar106.field_0._48_4_ = (uint)bVar54 * auVar87._48_4_ | (uint)!bVar54 * auVar90._48_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xd) & 1);
        vVar106.field_0._52_4_ = (uint)bVar54 * auVar87._52_4_ | (uint)!bVar54 * auVar90._52_4_;
        bVar54 = (bool)((byte)(uVar55 >> 0xe) & 1);
        vVar106.field_0._56_4_ = (uint)bVar54 * auVar87._56_4_ | (uint)!bVar54 * auVar90._56_4_;
        bVar54 = SUB81(uVar55 >> 0xf,0);
        vVar106.field_0._60_4_ = (uint)bVar54 * auVar87._60_4_ | (uint)!bVar54 * auVar90._60_4_;
        bVar54 = (bool)((byte)uVar66 & 1);
        vVar107.field_0._0_4_ = (uint)bVar54 * auVar88._0_4_ | (uint)!bVar54 * auVar91._0_4_;
        bVar54 = (bool)((byte)(uVar66 >> 1) & 1);
        vVar107.field_0._4_4_ = (uint)bVar54 * auVar88._4_4_ | (uint)!bVar54 * auVar91._4_4_;
        bVar54 = (bool)((byte)(uVar66 >> 2) & 1);
        vVar107.field_0._8_4_ = (uint)bVar54 * auVar88._8_4_ | (uint)!bVar54 * auVar91._8_4_;
        bVar54 = (bool)((byte)(uVar66 >> 3) & 1);
        vVar107.field_0._12_4_ = (uint)bVar54 * auVar88._12_4_ | (uint)!bVar54 * auVar91._12_4_;
        bVar54 = (bool)((byte)(uVar66 >> 4) & 1);
        vVar107.field_0._16_4_ = (uint)bVar54 * auVar88._16_4_ | (uint)!bVar54 * auVar91._16_4_;
        bVar54 = (bool)((byte)(uVar66 >> 5) & 1);
        vVar107.field_0._20_4_ = (uint)bVar54 * auVar88._20_4_ | (uint)!bVar54 * auVar91._20_4_;
        bVar54 = (bool)((byte)(uVar66 >> 6) & 1);
        vVar107.field_0._24_4_ = (uint)bVar54 * auVar88._24_4_ | (uint)!bVar54 * auVar91._24_4_;
        bVar54 = (bool)((byte)(uVar66 >> 7) & 1);
        vVar107.field_0._28_4_ = (uint)bVar54 * auVar88._28_4_ | (uint)!bVar54 * auVar91._28_4_;
        bVar54 = (bool)((byte)(uVar66 >> 8) & 1);
        vVar107.field_0._32_4_ = (uint)bVar54 * auVar88._32_4_ | (uint)!bVar54 * auVar91._32_4_;
        bVar54 = (bool)((byte)(uVar66 >> 9) & 1);
        vVar107.field_0._36_4_ = (uint)bVar54 * auVar88._36_4_ | (uint)!bVar54 * auVar91._36_4_;
        bVar54 = (bool)((byte)(uVar66 >> 10) & 1);
        vVar107.field_0._40_4_ = (uint)bVar54 * auVar88._40_4_ | (uint)!bVar54 * auVar91._40_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xb) & 1);
        vVar107.field_0._44_4_ = (uint)bVar54 * auVar88._44_4_ | (uint)!bVar54 * auVar91._44_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xc) & 1);
        vVar107.field_0._48_4_ = (uint)bVar54 * auVar88._48_4_ | (uint)!bVar54 * auVar91._48_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xd) & 1);
        vVar107.field_0._52_4_ = (uint)bVar54 * auVar88._52_4_ | (uint)!bVar54 * auVar91._52_4_;
        bVar54 = (bool)((byte)(uVar66 >> 0xe) & 1);
        vVar107.field_0._56_4_ = (uint)bVar54 * auVar88._56_4_ | (uint)!bVar54 * auVar91._56_4_;
        bVar54 = SUB81(uVar66 >> 0xf,0);
        vVar107.field_0._60_4_ = (uint)bVar54 * auVar88._60_4_ | (uint)!bVar54 * auVar91._60_4_;
        bVar54 = (bool)((byte)uVar61 & 1);
        vVar108.field_0._0_4_ = (uint)bVar54 * auVar105._0_4_ | (uint)!bVar54 * auVar89._0_4_;
        bVar54 = (bool)((byte)(uVar61 >> 1) & 1);
        vVar108.field_0._4_4_ = (uint)bVar54 * auVar105._4_4_ | (uint)!bVar54 * auVar89._4_4_;
        bVar54 = (bool)((byte)(uVar61 >> 2) & 1);
        vVar108.field_0._8_4_ = (uint)bVar54 * auVar105._8_4_ | (uint)!bVar54 * auVar89._8_4_;
        bVar54 = (bool)((byte)(uVar61 >> 3) & 1);
        vVar108.field_0._12_4_ = (uint)bVar54 * auVar105._12_4_ | (uint)!bVar54 * auVar89._12_4_;
        bVar54 = (bool)((byte)(uVar61 >> 4) & 1);
        vVar108.field_0._16_4_ = (uint)bVar54 * auVar105._16_4_ | (uint)!bVar54 * auVar89._16_4_;
        bVar54 = (bool)((byte)(uVar61 >> 5) & 1);
        vVar108.field_0._20_4_ = (uint)bVar54 * auVar105._20_4_ | (uint)!bVar54 * auVar89._20_4_;
        bVar54 = (bool)((byte)(uVar61 >> 6) & 1);
        vVar108.field_0._24_4_ = (uint)bVar54 * auVar105._24_4_ | (uint)!bVar54 * auVar89._24_4_;
        bVar54 = (bool)((byte)(uVar61 >> 7) & 1);
        vVar108.field_0._28_4_ = (uint)bVar54 * auVar105._28_4_ | (uint)!bVar54 * auVar89._28_4_;
        bVar54 = (bool)((byte)(uVar61 >> 8) & 1);
        vVar108.field_0._32_4_ = (uint)bVar54 * auVar105._32_4_ | (uint)!bVar54 * auVar89._32_4_;
        bVar54 = (bool)((byte)(uVar61 >> 9) & 1);
        vVar108.field_0._36_4_ = (uint)bVar54 * auVar105._36_4_ | (uint)!bVar54 * auVar89._36_4_;
        bVar54 = (bool)((byte)(uVar61 >> 10) & 1);
        vVar108.field_0._40_4_ = (uint)bVar54 * auVar105._40_4_ | (uint)!bVar54 * auVar89._40_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xb) & 1);
        vVar108.field_0._44_4_ = (uint)bVar54 * auVar105._44_4_ | (uint)!bVar54 * auVar89._44_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xc) & 1);
        vVar108.field_0._48_4_ = (uint)bVar54 * auVar105._48_4_ | (uint)!bVar54 * auVar89._48_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xd) & 1);
        vVar108.field_0._52_4_ = (uint)bVar54 * auVar105._52_4_ | (uint)!bVar54 * auVar89._52_4_;
        bVar54 = (bool)((byte)(uVar61 >> 0xe) & 1);
        vVar108.field_0._56_4_ = (uint)bVar54 * auVar105._56_4_ | (uint)!bVar54 * auVar89._56_4_;
        bVar54 = SUB81(uVar61 >> 0xf,0);
        vVar108.field_0._60_4_ = (uint)bVar54 * auVar105._60_4_ | (uint)!bVar54 * auVar89._60_4_;
        auVar74 = vmulps_avx512f(auVar80,(undefined1  [64])vVar108.field_0);
        auVar74 = vfmadd213ps_avx512f(auVar79,(undefined1  [64])vVar107.field_0,auVar74);
        auVar74 = vfmadd213ps_avx512f(auVar78,(undefined1  [64])vVar106.field_0,auVar74);
        auVar77 = vaddps_avx512f(auVar74,auVar74);
        auVar74 = vmulps_avx512f(auVar83,(undefined1  [64])vVar108.field_0);
        auVar74 = vfmadd213ps_avx512f(auVar82,(undefined1  [64])vVar107.field_0,auVar74);
        auVar74 = vfmadd213ps_avx512f(auVar81,(undefined1  [64])vVar106.field_0,auVar74);
        auVar78 = vrcp14ps_avx512f(auVar77);
        auVar74 = vaddps_avx512f(auVar74,auVar74);
        auVar79 = vfnmadd213ps_avx512f(auVar78,auVar77,auVar73);
        auVar78 = vfmadd132ps_avx512f(auVar79,auVar78,auVar78);
        local_a640 = vmulps_avx512f(auVar74,auVar78);
        uVar24 = vcmpps_avx512f(local_a640,*(undefined1 (*) [64])(ray + 0x200),2);
        uVar25 = vcmpps_avx512f(local_a640,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        auVar68 = vxorps_avx512vl(auVar68,auVar68);
        auVar74 = ZEXT1664(auVar68);
        uVar26 = vcmpps_avx512f(auVar77,auVar74,4);
        uVar63 = uVar63 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26;
        if (uVar63 != 0) {
          uVar55 = CONCAT44(0,*(uint *)(lVar60 + 0x40 + lVar64 * 4));
          local_a880._0_8_ = uVar55;
          pGVar2 = (context->scene->geometries).items[uVar55].ptr;
          auVar77 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
          uVar24 = vptestmd_avx512f(auVar77,*(undefined1 (*) [64])(ray + 0x240));
          uVar63 = uVar63 & (ushort)uVar24;
          if (uVar63 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_a840._0_4_ = uVar57;
              auVar49._8_4_ = 0x219392ef;
              auVar49._0_8_ = 0x219392ef219392ef;
              auVar49._12_4_ = 0x219392ef;
              auVar49._16_4_ = 0x219392ef;
              auVar49._20_4_ = 0x219392ef;
              auVar49._24_4_ = 0x219392ef;
              auVar49._28_4_ = 0x219392ef;
              auVar49._32_4_ = 0x219392ef;
              auVar49._36_4_ = 0x219392ef;
              auVar49._40_4_ = 0x219392ef;
              auVar49._44_4_ = 0x219392ef;
              auVar49._48_4_ = 0x219392ef;
              auVar49._52_4_ = 0x219392ef;
              auVar49._56_4_ = 0x219392ef;
              auVar49._60_4_ = 0x219392ef;
              uVar56 = vcmpps_avx512f(auVar86,auVar49,5);
              auVar70 = vrcp14ps_avx512f(auVar76);
              auVar127 = vfnmadd213ps_avx512f(auVar76,auVar70,auVar73);
              auVar70 = vfmadd132ps_avx512f(auVar127,auVar70,auVar70);
              auVar109._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * auVar70._4_4_;
              auVar109._0_4_ = (uint)((byte)uVar56 & 1) * auVar70._0_4_;
              auVar109._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * auVar70._8_4_;
              auVar109._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * auVar70._12_4_;
              auVar109._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar70._16_4_;
              auVar109._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar70._20_4_;
              auVar109._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar70._24_4_;
              auVar109._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * auVar70._28_4_;
              auVar109._32_4_ = (uint)((byte)(uVar56 >> 8) & 1) * auVar70._32_4_;
              auVar109._36_4_ = (uint)((byte)(uVar56 >> 9) & 1) * auVar70._36_4_;
              auVar109._40_4_ = (uint)((byte)(uVar56 >> 10) & 1) * auVar70._40_4_;
              auVar109._44_4_ = (uint)((byte)(uVar56 >> 0xb) & 1) * auVar70._44_4_;
              auVar109._48_4_ = (uint)((byte)(uVar56 >> 0xc) & 1) * auVar70._48_4_;
              auVar109._52_4_ = (uint)((byte)(uVar56 >> 0xd) & 1) * auVar70._52_4_;
              auVar109._56_4_ = (uint)((byte)(uVar56 >> 0xe) & 1) * auVar70._56_4_;
              auVar109._60_4_ = (uint)(byte)(uVar56 >> 0xf) * auVar70._60_4_;
              auVar70 = vmulps_avx512f(auVar95,auVar109);
              auVar70 = vminps_avx512f(auVar70,auVar73);
              auVar127 = vmulps_avx512f(auVar96,auVar109);
              auVar127 = vminps_avx512f(auVar127,auVar73);
              local_a5c0 = vsubps_avx512f(auVar73,auVar70);
              local_a600 = vsubps_avx512f(auVar73,auVar127);
              local_a940._8_8_ = (vfloat_impl<16> *)local_a440;
              local_a940._0_8_ = &local_a7c0;
              _Stack_a930._M_head_impl = (vfloat_impl<16> *)local_a400;
              auStack_a920 = auVar75._32_32_;
              _Stack_a928._M_head_impl = (vfloat_impl<16> *)local_a3c0;
              local_a800._0_8_ = pGVar2;
              local_a480._0_4_ = *(undefined4 *)(lVar60 + 0x50 + lVar64 * 4);
              local_a700.field_0.x.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar106.field_0;
              local_a700.field_0.y.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar107.field_0;
              local_a700.field_0.z.field_0 = (vfloat_impl<16>)(undefined1  [64])vVar108.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
              ::
              _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                          *)local_a940,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                          *)&local_a700.field_0);
              pRVar4 = context->user;
              auVar70 = vpbroadcastd_avx512f();
              auVar127 = vpbroadcastd_avx512f();
              local_a700._8_8_ = uStack_a7b8;
              local_a700._0_8_ = local_a7c0;
              local_a700._16_8_ = uStack_a7b0;
              local_a700._24_8_ = uStack_a7a8;
              local_a700._32_8_ = uStack_a7a0;
              local_a700._40_8_ = uStack_a798;
              local_a700._48_8_ = uStack_a790;
              local_a700._56_8_ = uStack_a788;
              local_a700._72_8_ = uStack_a778;
              local_a700._64_8_ = local_a780;
              local_a700._80_8_ = uStack_a770;
              local_a700._88_8_ = uStack_a768;
              local_a700._96_8_ = uStack_a760;
              local_a700._104_8_ = uStack_a758;
              local_a700._112_8_ = uStack_a750;
              local_a700._120_8_ = uStack_a748;
              local_a700._136_8_ = uStack_a738;
              local_a700._128_8_ = local_a740;
              local_a700._144_8_ = uStack_a730;
              local_a700._152_8_ = uStack_a728;
              local_a700._160_8_ = uStack_a720;
              local_a700._168_8_ = uStack_a718;
              local_a700._176_8_ = uStack_a710;
              local_a700._184_8_ = uStack_a708;
              local_a5c0 = vmovdqa64_avx512f(auVar127);
              local_a580 = vmovdqa64_avx512f(auVar70);
              auVar22 = vpcmpeqd_avx2(auVar70._0_32_,auVar70._0_32_);
              local_a8d8[3] = auVar22;
              local_a8d8[2] = auVar22;
              local_a8d8[1] = auVar22;
              *local_a8d8 = auVar22;
              local_a540 = vbroadcastss_avx512f(ZEXT416(pRVar4->instID[0]));
              local_a500 = vbroadcastss_avx512f(ZEXT416(pRVar4->instPrimID[0]));
              local_a880 = *(undefined1 (*) [64])(ray + 0x200);
              auVar70 = vblendmps_avx512f(local_a880,local_a440);
              bVar54 = (bool)((byte)uVar63 & 1);
              bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
              bVar12 = (bool)((byte)(uVar63 >> 7) & 1);
              bVar13 = (byte)(uVar63 >> 8);
              bVar14 = (bool)(bVar13 >> 1 & 1);
              bVar15 = (bool)(bVar13 >> 2 & 1);
              bVar16 = (bool)(bVar13 >> 3 & 1);
              bVar17 = (bool)(bVar13 >> 4 & 1);
              bVar18 = (bool)(bVar13 >> 5 & 1);
              bVar19 = (bool)(bVar13 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar54 * auVar70._0_4_ | (uint)!bVar54 * local_a500._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar6 * auVar70._4_4_ | (uint)!bVar6 * local_a500._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * local_a500._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar8 * auVar70._12_4_ | (uint)!bVar8 * local_a500._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar9 * auVar70._16_4_ | (uint)!bVar9 * local_a500._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar10 * auVar70._20_4_ | (uint)!bVar10 * local_a500._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar11 * auVar70._24_4_ | (uint)!bVar11 * local_a500._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * local_a500._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar13 & 1) * auVar70._32_4_ |
                   (uint)!(bool)(bVar13 & 1) * local_a500._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar14 * auVar70._36_4_ | (uint)!bVar14 * local_a500._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar15 * auVar70._40_4_ | (uint)!bVar15 * local_a500._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar16 * auVar70._44_4_ | (uint)!bVar16 * local_a500._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar17 * auVar70._48_4_ | (uint)!bVar17 * local_a500._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar18 * auVar70._52_4_ | (uint)!bVar18 * local_a500._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar19 * auVar70._56_4_ | (uint)!bVar19 * local_a500._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar63 >> 0xf) * auVar70._60_4_ |
                   (uint)!(bool)(bVar13 >> 7) * local_a500._60_4_;
              auVar75 = vpmovm2d_avx512dq((ulong)uVar63);
              _local_a940 = vmovdqa64_avx512f(auVar75);
              local_a8d0.valid = (int *)local_a940;
              local_a8d0.geometryUserPtr = *(void **)(local_a800._0_8_ + 0x18);
              local_a8d0.context = context->user;
              local_a8d0.ray = (RTCRayN *)ray;
              local_a8d0.hit = (RTCHitN *)&local_a700;
              local_a8d0.N = 0x10;
              if (*(code **)(local_a800._0_8_ + 0x48) != (code *)0x0) {
                (**(code **)(local_a800._0_8_ + 0x48))(&local_a8d0);
                auVar75 = vmovdqa64_avx512f(_local_a940);
              }
              uVar24 = vptestmd_avx512f(auVar75,auVar75);
              if ((short)uVar24 == 0) {
                uVar56 = 0;
                auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                auVar74 = ZEXT1664(auVar68);
                uVar57 = local_a840._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                  auVar74 = ZEXT1664(auVar68);
                }
                else {
                  auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                  auVar74 = ZEXT1664(auVar68);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_a800._0_8_ + 0x3e) & 0x40) != 0)) {
                    (*p_Var5)(&local_a8d0);
                    auVar68 = vxorps_avx512vl(auVar68,auVar68);
                    auVar74 = ZEXT1664(auVar68);
                    auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                    auVar127 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                    auVar70 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar71 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                    auVar75 = vmovdqa64_avx512f(_local_a940);
                  }
                }
                uVar56 = vptestmd_avx512f(auVar75,auVar75);
                auVar76 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar54 = (bool)((byte)uVar56 & 1);
                auVar75._0_4_ =
                     (uint)bVar54 * auVar76._0_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x200)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
                auVar75._4_4_ =
                     (uint)bVar54 * auVar76._4_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x204)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
                auVar75._8_4_ =
                     (uint)bVar54 * auVar76._8_4_ | (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x208)
                ;
                bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
                auVar75._12_4_ =
                     (uint)bVar54 * auVar76._12_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x20c);
                bVar54 = (bool)((byte)(uVar56 >> 4) & 1);
                auVar75._16_4_ =
                     (uint)bVar54 * auVar76._16_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x210);
                bVar54 = (bool)((byte)(uVar56 >> 5) & 1);
                auVar75._20_4_ =
                     (uint)bVar54 * auVar76._20_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x214);
                bVar54 = (bool)((byte)(uVar56 >> 6) & 1);
                auVar75._24_4_ =
                     (uint)bVar54 * auVar76._24_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x218);
                bVar54 = (bool)((byte)(uVar56 >> 7) & 1);
                auVar75._28_4_ =
                     (uint)bVar54 * auVar76._28_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x21c);
                bVar54 = (bool)((byte)(uVar56 >> 8) & 1);
                auVar75._32_4_ =
                     (uint)bVar54 * auVar76._32_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x220);
                bVar54 = (bool)((byte)(uVar56 >> 9) & 1);
                auVar75._36_4_ =
                     (uint)bVar54 * auVar76._36_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x224);
                bVar54 = (bool)((byte)(uVar56 >> 10) & 1);
                auVar75._40_4_ =
                     (uint)bVar54 * auVar76._40_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x228);
                bVar54 = (bool)((byte)(uVar56 >> 0xb) & 1);
                auVar75._44_4_ =
                     (uint)bVar54 * auVar76._44_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x22c);
                bVar54 = (bool)((byte)(uVar56 >> 0xc) & 1);
                auVar75._48_4_ =
                     (uint)bVar54 * auVar76._48_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x230);
                bVar54 = (bool)((byte)(uVar56 >> 0xd) & 1);
                auVar75._52_4_ =
                     (uint)bVar54 * auVar76._52_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x234);
                bVar54 = (bool)((byte)(uVar56 >> 0xe) & 1);
                auVar75._56_4_ =
                     (uint)bVar54 * auVar76._56_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x238);
                bVar54 = SUB81(uVar56 >> 0xf,0);
                auVar75._60_4_ =
                     (uint)bVar54 * auVar76._60_4_ |
                     (uint)!bVar54 * *(int *)(local_a8d0.ray + 0x23c);
                *(undefined1 (*) [64])(local_a8d0.ray + 0x200) = auVar75;
                uVar57 = local_a840._0_4_;
              }
              uVar63 = (ushort)uVar56;
              bVar54 = (bool)((byte)uVar56 & 1);
              bVar6 = (bool)((byte)(uVar56 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar56 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar56 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar56 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar56 >> 6) & 1);
              bVar12 = (bool)((byte)(uVar56 >> 7) & 1);
              bVar14 = (bool)((byte)(uVar56 >> 8) & 1);
              bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
              bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
              bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
              bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
              bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
              bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
              bVar21 = SUB81(uVar56 >> 0xf,0);
              *(uint *)local_a958 =
                   (uint)bVar54 * *(int *)local_a958 | (uint)!bVar54 * local_a880._0_4_;
              *(uint *)(local_a958 + 4) =
                   (uint)bVar6 * *(int *)(local_a958 + 4) | (uint)!bVar6 * local_a880._4_4_;
              *(uint *)(local_a958 + 8) =
                   (uint)bVar7 * *(int *)(local_a958 + 8) | (uint)!bVar7 * local_a880._8_4_;
              *(uint *)(local_a958 + 0xc) =
                   (uint)bVar8 * *(int *)(local_a958 + 0xc) | (uint)!bVar8 * local_a880._12_4_;
              *(uint *)(local_a958 + 0x10) =
                   (uint)bVar9 * *(int *)(local_a958 + 0x10) | (uint)!bVar9 * local_a880._16_4_;
              *(uint *)(local_a958 + 0x14) =
                   (uint)bVar10 * *(int *)(local_a958 + 0x14) | (uint)!bVar10 * local_a880._20_4_;
              *(uint *)(local_a958 + 0x18) =
                   (uint)bVar11 * *(int *)(local_a958 + 0x18) | (uint)!bVar11 * local_a880._24_4_;
              *(uint *)(local_a958 + 0x1c) =
                   (uint)bVar12 * *(int *)(local_a958 + 0x1c) | (uint)!bVar12 * local_a880._28_4_;
              *(uint *)(local_a958 + 0x20) =
                   (uint)bVar14 * *(int *)(local_a958 + 0x20) | (uint)!bVar14 * local_a880._32_4_;
              *(uint *)(local_a958 + 0x24) =
                   (uint)bVar15 * *(int *)(local_a958 + 0x24) | (uint)!bVar15 * local_a880._36_4_;
              *(uint *)(local_a958 + 0x28) =
                   (uint)bVar16 * *(int *)(local_a958 + 0x28) | (uint)!bVar16 * local_a880._40_4_;
              *(uint *)(local_a958 + 0x2c) =
                   (uint)bVar17 * *(int *)(local_a958 + 0x2c) | (uint)!bVar17 * local_a880._44_4_;
              *(uint *)(local_a958 + 0x30) =
                   (uint)bVar18 * *(int *)(local_a958 + 0x30) | (uint)!bVar18 * local_a880._48_4_;
              *(uint *)(local_a958 + 0x34) =
                   (uint)bVar19 * *(int *)(local_a958 + 0x34) | (uint)!bVar19 * local_a880._52_4_;
              *(uint *)(local_a958 + 0x38) =
                   (uint)bVar20 * *(int *)(local_a958 + 0x38) | (uint)!bVar20 * local_a880._56_4_;
              *(uint *)(local_a958 + 0x3c) =
                   (uint)bVar21 * *(int *)(local_a958 + 0x3c) | (uint)!bVar21 * local_a880._60_4_;
            }
            uVar56 = (ulong)(uVar57 & (ushort)~uVar63);
          }
        }
      }
      lVar64 = lVar64 + 1;
    } while ((short)uVar56 != 0);
    uVar56 = 0;
LAB_01e4aef8:
    lVar58 = local_a950 + 1;
    uVar63 = (ushort)uVar56 & (ushort)local_a970;
    local_a970 = (uint)CONCAT62((int6)(uVar56 >> 0x10),uVar63);
  } while (uVar63 != 0);
  local_a970 = 0;
LAB_01e4af14:
  local_a994 = local_a994 | ~local_a970;
  if ((short)local_a994 == -1) {
    local_a994 = 0xffff;
    goto LAB_01e4b065;
  }
  auVar75 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar54 = (bool)((byte)local_a994 & 1);
  bVar6 = (bool)((byte)(local_a994 >> 1) & 1);
  bVar7 = (bool)((byte)(local_a994 >> 2) & 1);
  bVar8 = (bool)((byte)(local_a994 >> 3) & 1);
  bVar9 = (bool)((byte)(local_a994 >> 4) & 1);
  bVar10 = (bool)((byte)(local_a994 >> 5) & 1);
  bVar11 = (bool)((byte)(local_a994 >> 6) & 1);
  bVar12 = (bool)((byte)(local_a994 >> 7) & 1);
  bVar14 = (bool)((byte)(local_a994 >> 8) & 1);
  bVar15 = (bool)((byte)(local_a994 >> 9) & 1);
  bVar16 = (bool)((byte)(local_a994 >> 10) & 1);
  bVar17 = (bool)((byte)(local_a994 >> 0xb) & 1);
  bVar18 = (bool)((byte)(local_a994 >> 0xc) & 1);
  bVar19 = (bool)((byte)(local_a994 >> 0xd) & 1);
  bVar20 = (bool)((byte)(local_a994 >> 0xe) & 1);
  bVar21 = (bool)((byte)(local_a994 >> 0xf) & 1);
  local_9f80._4_4_ = (uint)bVar6 * auVar75._4_4_ | (uint)!bVar6 * local_9f80._4_4_;
  local_9f80._0_4_ = (uint)bVar54 * auVar75._0_4_ | (uint)!bVar54 * local_9f80._0_4_;
  local_9f80._8_4_ = (uint)bVar7 * auVar75._8_4_ | (uint)!bVar7 * local_9f80._8_4_;
  local_9f80._12_4_ = (uint)bVar8 * auVar75._12_4_ | (uint)!bVar8 * local_9f80._12_4_;
  local_9f80._16_4_ = (uint)bVar9 * auVar75._16_4_ | (uint)!bVar9 * local_9f80._16_4_;
  local_9f80._20_4_ = (uint)bVar10 * auVar75._20_4_ | (uint)!bVar10 * local_9f80._20_4_;
  local_9f80._24_4_ = (uint)bVar11 * auVar75._24_4_ | (uint)!bVar11 * local_9f80._24_4_;
  local_9f80._28_4_ = (uint)bVar12 * auVar75._28_4_ | (uint)!bVar12 * local_9f80._28_4_;
  local_9f80._32_4_ = (uint)bVar14 * auVar75._32_4_ | (uint)!bVar14 * local_9f80._32_4_;
  local_9f80._36_4_ = (uint)bVar15 * auVar75._36_4_ | (uint)!bVar15 * local_9f80._36_4_;
  local_9f80._40_4_ = (uint)bVar16 * auVar75._40_4_ | (uint)!bVar16 * local_9f80._40_4_;
  local_9f80._44_4_ = (uint)bVar17 * auVar75._44_4_ | (uint)!bVar17 * local_9f80._44_4_;
  local_9f80._48_4_ = (uint)bVar18 * auVar75._48_4_ | (uint)!bVar18 * local_9f80._48_4_;
  local_9f80._52_4_ = (uint)bVar19 * auVar75._52_4_ | (uint)!bVar19 * local_9f80._52_4_;
  local_9f80._56_4_ = (uint)bVar20 * auVar75._56_4_ | (uint)!bVar20 * local_9f80._56_4_;
  local_9f80._60_4_ = (uint)bVar21 * auVar75._60_4_ | (uint)!bVar21 * local_9f80._60_4_;
  goto LAB_01e49628;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }